

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  int iVar46;
  uint uVar47;
  uint uVar48;
  long lVar50;
  byte bVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  undefined4 uVar57;
  undefined8 in_R10;
  float fVar58;
  float fVar59;
  float fVar82;
  float fVar84;
  vint4 bi_2;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar83;
  float fVar85;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined8 uVar86;
  vint4 bi_1;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  vint4 ai_2;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar128;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar129;
  float fVar139;
  vint4 ai;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  vint4 bi;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  float fVar154;
  float fVar155;
  float fVar174;
  float fVar175;
  vint4 ai_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar176;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  float fVar188;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar181 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar189;
  undefined1 auVar187 [32];
  float fVar193;
  float fVar203;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar204;
  float fVar219;
  vfloat4 a0_2;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar220;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  vfloat4 a0_3;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  vfloat4 a0_1;
  undefined1 auVar242 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar241 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar251;
  float fVar261;
  float fVar262;
  vfloat4 a0;
  undefined1 auVar252 [16];
  float fVar263;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar266 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar277 [32];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 local_720 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [32];
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  uint local_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  undefined1 local_500 [16];
  uint auStack_4f0 [4];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar49;
  undefined1 auVar276 [32];
  
  PVar2 = prim[1];
  uVar54 = (ulong)(byte)PVar2;
  fVar58 = *(float *)(prim + uVar54 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar54 * 0x19 + 6));
  auVar60._0_4_ = fVar58 * auVar8._0_4_;
  auVar60._4_4_ = fVar58 * auVar8._4_4_;
  auVar60._8_4_ = fVar58 * auVar8._8_4_;
  auVar60._12_4_ = fVar58 * auVar8._12_4_;
  auVar140._0_4_ = fVar58 * auVar9._0_4_;
  auVar140._4_4_ = fVar58 * auVar9._4_4_;
  auVar140._8_4_ = fVar58 * auVar9._8_4_;
  auVar140._12_4_ = fVar58 * auVar9._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 6 + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xc + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xd + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x12 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x13 + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x14 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar264._4_4_ = auVar140._0_4_;
  auVar264._0_4_ = auVar140._0_4_;
  auVar264._8_4_ = auVar140._0_4_;
  auVar264._12_4_ = auVar140._0_4_;
  auVar87 = vshufps_avx(auVar140,auVar140,0x55);
  auVar242 = vshufps_avx(auVar140,auVar140,0xaa);
  fVar58 = auVar242._0_4_;
  auVar221._0_4_ = fVar58 * auVar121._0_4_;
  fVar82 = auVar242._4_4_;
  auVar221._4_4_ = fVar82 * auVar121._4_4_;
  fVar84 = auVar242._8_4_;
  auVar221._8_4_ = fVar84 * auVar121._8_4_;
  fVar115 = auVar242._12_4_;
  auVar221._12_4_ = fVar115 * auVar121._12_4_;
  auVar205._0_4_ = auVar13._0_4_ * fVar58;
  auVar205._4_4_ = auVar13._4_4_ * fVar82;
  auVar205._8_4_ = auVar13._8_4_ * fVar84;
  auVar205._12_4_ = auVar13._12_4_ * fVar115;
  auVar177._0_4_ = auVar106._0_4_ * fVar58;
  auVar177._4_4_ = auVar106._4_4_ * fVar82;
  auVar177._8_4_ = auVar106._8_4_ * fVar84;
  auVar177._12_4_ = auVar106._12_4_ * fVar115;
  auVar242 = vfmadd231ps_fma(auVar221,auVar87,auVar9);
  auVar88 = vfmadd231ps_fma(auVar205,auVar87,auVar12);
  auVar87 = vfmadd231ps_fma(auVar177,auVar61,auVar87);
  auVar116 = vfmadd231ps_fma(auVar242,auVar264,auVar8);
  auVar88 = vfmadd231ps_fma(auVar88,auVar264,auVar11);
  auVar131 = vfmadd231ps_fma(auVar87,auVar62,auVar264);
  auVar265._4_4_ = auVar60._0_4_;
  auVar265._0_4_ = auVar60._0_4_;
  auVar265._8_4_ = auVar60._0_4_;
  auVar265._12_4_ = auVar60._0_4_;
  auVar87 = vshufps_avx(auVar60,auVar60,0x55);
  auVar242 = vshufps_avx(auVar60,auVar60,0xaa);
  fVar58 = auVar242._0_4_;
  auVar118._0_4_ = fVar58 * auVar121._0_4_;
  fVar82 = auVar242._4_4_;
  auVar118._4_4_ = fVar82 * auVar121._4_4_;
  fVar84 = auVar242._8_4_;
  auVar118._8_4_ = fVar84 * auVar121._8_4_;
  fVar115 = auVar242._12_4_;
  auVar118._12_4_ = fVar115 * auVar121._12_4_;
  auVar235._0_4_ = auVar13._0_4_ * fVar58;
  auVar235._4_4_ = auVar13._4_4_ * fVar82;
  auVar235._8_4_ = auVar13._8_4_ * fVar84;
  auVar235._12_4_ = auVar13._12_4_ * fVar115;
  auVar242._0_4_ = auVar106._0_4_ * fVar58;
  auVar242._4_4_ = auVar106._4_4_ * fVar82;
  auVar242._8_4_ = auVar106._8_4_ * fVar84;
  auVar242._12_4_ = auVar106._12_4_ * fVar115;
  auVar9 = vfmadd231ps_fma(auVar118,auVar87,auVar9);
  auVar121 = vfmadd231ps_fma(auVar235,auVar87,auVar12);
  auVar12 = vfmadd231ps_fma(auVar242,auVar87,auVar61);
  auVar13 = vfmadd231ps_fma(auVar9,auVar265,auVar8);
  auVar61 = vfmadd231ps_fma(auVar121,auVar265,auVar11);
  local_500._8_4_ = 0x7fffffff;
  local_500._0_8_ = 0x7fffffff7fffffff;
  local_500._12_4_ = 0x7fffffff;
  auVar106 = vfmadd231ps_fma(auVar12,auVar265,auVar62);
  auVar8 = vandps_avx(auVar116,local_500);
  auVar130._8_4_ = 0x219392ef;
  auVar130._0_8_ = 0x219392ef219392ef;
  auVar130._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar130,1);
  auVar9 = vblendvps_avx(auVar116,auVar130,auVar8);
  auVar8 = vandps_avx(auVar88,local_500);
  auVar8 = vcmpps_avx(auVar8,auVar130,1);
  auVar121 = vblendvps_avx(auVar88,auVar130,auVar8);
  auVar8 = vandps_avx(local_500,auVar131);
  auVar8 = vcmpps_avx(auVar8,auVar130,1);
  auVar8 = vblendvps_avx(auVar131,auVar130,auVar8);
  auVar11 = vrcpps_avx(auVar9);
  auVar178._8_4_ = 0x3f800000;
  auVar178._0_8_ = 0x3f8000003f800000;
  auVar178._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar11,auVar178);
  auVar11 = vfmadd132ps_fma(auVar9,auVar11,auVar11);
  auVar9 = vrcpps_avx(auVar121);
  auVar121 = vfnmadd213ps_fma(auVar121,auVar9,auVar178);
  auVar12 = vfmadd132ps_fma(auVar121,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar178);
  auVar62 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar54 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar121 = vsubps_avx(auVar8,auVar13);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar54 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar131._0_4_ = auVar11._0_4_ * auVar121._0_4_;
  auVar131._4_4_ = auVar11._4_4_ * auVar121._4_4_;
  auVar131._8_4_ = auVar11._8_4_ * auVar121._8_4_;
  auVar131._12_4_ = auVar11._12_4_ * auVar121._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar141._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar141._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar141._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar141._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar54 * 0xe + 6);
  auVar8 = vpmovsxwd_avx(auVar121);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vsubps_avx(auVar8,auVar61);
  auVar88._1_3_ = 0;
  auVar88[0] = PVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar156._0_4_ = auVar12._0_4_ * auVar9._0_4_;
  auVar156._4_4_ = auVar12._4_4_ * auVar9._4_4_;
  auVar156._8_4_ = auVar12._8_4_ * auVar9._8_4_;
  auVar156._12_4_ = auVar12._12_4_ * auVar9._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar61);
  auVar87._0_4_ = auVar12._0_4_ * auVar8._0_4_;
  auVar87._4_4_ = auVar12._4_4_ * auVar8._4_4_;
  auVar87._8_4_ = auVar12._8_4_ * auVar8._8_4_;
  auVar87._12_4_ = auVar12._12_4_ * auVar8._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar54 * 0x15 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar106);
  auVar116._0_4_ = auVar62._0_4_ * auVar8._0_4_;
  auVar116._4_4_ = auVar62._4_4_ * auVar8._4_4_;
  auVar116._8_4_ = auVar62._8_4_ * auVar8._8_4_;
  auVar116._12_4_ = auVar62._12_4_ * auVar8._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar54 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar13);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar106);
  auVar61._0_4_ = auVar62._0_4_ * auVar8._0_4_;
  auVar61._4_4_ = auVar62._4_4_ * auVar8._4_4_;
  auVar61._8_4_ = auVar62._8_4_ * auVar8._8_4_;
  auVar61._12_4_ = auVar62._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar131,auVar141);
  auVar9 = vpminsd_avx(auVar156,auVar87);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vpminsd_avx(auVar116,auVar61);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar206._4_4_ = uVar57;
  auVar206._0_4_ = uVar57;
  auVar206._8_4_ = uVar57;
  auVar206._12_4_ = uVar57;
  auVar9 = vmaxps_avx(auVar9,auVar206);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  local_490._0_4_ = auVar8._0_4_ * 0.99999964;
  local_490._4_4_ = auVar8._4_4_ * 0.99999964;
  local_490._8_4_ = auVar8._8_4_ * 0.99999964;
  local_490._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar131,auVar141);
  auVar9 = vpmaxsd_avx(auVar156,auVar87);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar9 = vpmaxsd_avx(auVar116,auVar61);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar106._4_4_ = uVar57;
  auVar106._0_4_ = uVar57;
  auVar106._8_4_ = uVar57;
  auVar106._12_4_ = uVar57;
  auVar9 = vminps_avx(auVar9,auVar106);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar62._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar62._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar62._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar62._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar88[4] = PVar2;
  auVar88._5_3_ = 0;
  auVar88[8] = PVar2;
  auVar88._9_3_ = 0;
  auVar88[0xc] = PVar2;
  auVar88._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar88,_DAT_01f4ad30);
  auVar8 = vcmpps_avx(local_490,auVar62,2);
  auVar8 = vandps_avx(auVar8,auVar9);
  uVar57 = vmovmskps_avx(auVar8);
  uVar54 = CONCAT44((int)((ulong)in_R10 >> 0x20),uVar57);
  auVar77._16_16_ = mm_lookupmask_ps._240_16_;
  auVar77._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar77,ZEXT832(0) << 0x20,0x80);
  iVar46 = 1 << ((uint)k & 0x1f);
  auVar78._4_4_ = iVar46;
  auVar78._0_4_ = iVar46;
  auVar78._8_4_ = iVar46;
  auVar78._12_4_ = iVar46;
  auVar78._16_4_ = iVar46;
  auVar78._20_4_ = iVar46;
  auVar78._24_4_ = iVar46;
  auVar78._28_4_ = iVar46;
  auVar15 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar77 = vpand_avx2(auVar78,auVar15);
  local_360 = vpcmpeqd_avx2(auVar77,auVar15);
LAB_0110bec6:
  if (uVar54 == 0) {
    return;
  }
  lVar50 = 0;
  for (uVar56 = uVar54; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  uVar48 = *(uint *)(prim + 2);
  uVar3 = *(uint *)(prim + lVar50 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar48].ptr;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar3);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar8 = *(undefined1 (*) [16])(_Var7 + uVar56 * (long)pvVar6);
  auVar9 = *(undefined1 (*) [16])(_Var7 + (uVar56 + 1) * (long)pvVar6);
  auVar121 = *(undefined1 (*) [16])(_Var7 + (uVar56 + 2) * (long)pvVar6);
  auVar11 = *(undefined1 (*) [16])(_Var7 + (long)pvVar6 * (uVar56 + 3));
  lVar50 = *(long *)&pGVar4[1].time_range.upper;
  auVar12 = *(undefined1 (*) [16])(lVar50 + (long)p_Var5 * uVar56);
  auVar13 = *(undefined1 (*) [16])(lVar50 + (long)p_Var5 * (uVar56 + 1));
  auVar62 = *(undefined1 (*) [16])(lVar50 + (long)p_Var5 * (uVar56 + 2));
  uVar54 = uVar54 - 1 & uVar54;
  auVar61 = *(undefined1 (*) [16])(lVar50 + (long)p_Var5 * (uVar56 + 3));
  if (uVar54 != 0) {
    uVar55 = uVar54 - 1 & uVar54;
    for (uVar56 = uVar54; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    }
    if (uVar55 != 0) {
      for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar116 = ZEXT816(0) << 0x40;
  auVar89._0_4_ = auVar61._0_4_ * 0.0;
  auVar89._4_4_ = auVar61._4_4_ * 0.0;
  auVar89._8_4_ = auVar61._8_4_ * 0.0;
  auVar89._12_4_ = auVar61._12_4_ * 0.0;
  auVar242 = vfmadd231ps_fma(auVar89,auVar62,auVar116);
  auVar87 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar13,auVar242);
  local_7a0._0_4_ = auVar12._0_4_ + auVar87._0_4_;
  local_7a0._4_4_ = auVar12._4_4_ + auVar87._4_4_;
  uStack_798._0_4_ = auVar12._8_4_ + auVar87._8_4_;
  uStack_798._4_4_ = auVar12._12_4_ + auVar87._12_4_;
  auVar266._8_4_ = 0x40400000;
  auVar266._0_8_ = 0x4040000040400000;
  auVar266._12_4_ = 0x40400000;
  auVar87 = vfmadd231ps_fma(auVar242,auVar13,auVar266);
  auVar88 = vfnmadd231ps_fma(auVar87,auVar12,auVar266);
  auVar239._0_4_ = auVar11._0_4_ * 0.0;
  auVar239._4_4_ = auVar11._4_4_ * 0.0;
  auVar239._8_4_ = auVar11._8_4_ * 0.0;
  auVar239._12_4_ = auVar11._12_4_ * 0.0;
  auVar242 = vfmadd231ps_fma(auVar239,auVar121,auVar116);
  auVar87 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar9,auVar242);
  auVar252._0_4_ = auVar8._0_4_ + auVar87._0_4_;
  auVar252._4_4_ = auVar8._4_4_ + auVar87._4_4_;
  auVar252._8_4_ = auVar8._8_4_ + auVar87._8_4_;
  auVar252._12_4_ = auVar8._12_4_ + auVar87._12_4_;
  auVar87 = vfmadd231ps_fma(auVar242,auVar9,auVar266);
  auVar242 = vfnmadd231ps_fma(auVar87,auVar8,auVar266);
  auVar87 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar62,auVar61);
  auVar87 = vfmadd231ps_fma(auVar87,auVar13,auVar116);
  auVar87 = vfmadd231ps_fma(auVar87,auVar12,auVar116);
  auVar132._0_4_ = auVar61._0_4_ * 3.0;
  auVar132._4_4_ = auVar61._4_4_ * 3.0;
  auVar132._8_4_ = auVar61._8_4_ * 3.0;
  auVar132._12_4_ = auVar61._12_4_ * 3.0;
  auVar62 = vfnmadd231ps_fma(auVar132,auVar266,auVar62);
  auVar13 = vfmadd231ps_fma(auVar62,auVar116,auVar13);
  auVar62 = vfnmadd231ps_fma(auVar13,auVar116,auVar12);
  auVar12 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar121,auVar11);
  auVar12 = vfmadd231ps_fma(auVar12,auVar9,auVar116);
  auVar12 = vfmadd231ps_fma(auVar12,auVar8,auVar116);
  auVar222._0_4_ = auVar11._0_4_ * 3.0;
  auVar222._4_4_ = auVar11._4_4_ * 3.0;
  auVar222._8_4_ = auVar11._8_4_ * 3.0;
  auVar222._12_4_ = auVar11._12_4_ * 3.0;
  auVar121 = vfnmadd231ps_fma(auVar222,auVar266,auVar121);
  auVar9 = vfmadd231ps_fma(auVar121,auVar116,auVar9);
  auVar61 = vfnmadd231ps_fma(auVar9,auVar116,auVar8);
  auVar8 = vshufps_avx(auVar88,auVar88,0xc9);
  auVar9 = vshufps_avx(auVar252,auVar252,0xc9);
  fVar83 = auVar88._0_4_;
  auVar157._0_4_ = fVar83 * auVar9._0_4_;
  fVar85 = auVar88._4_4_;
  auVar157._4_4_ = fVar85 * auVar9._4_4_;
  fVar59 = auVar88._8_4_;
  auVar157._8_4_ = fVar59 * auVar9._8_4_;
  fVar155 = auVar88._12_4_;
  auVar157._12_4_ = fVar155 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar157,auVar8,auVar252);
  auVar121 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar242,auVar242,0xc9);
  auVar158._0_4_ = fVar83 * auVar9._0_4_;
  auVar158._4_4_ = fVar85 * auVar9._4_4_;
  auVar158._8_4_ = fVar59 * auVar9._8_4_;
  auVar158._12_4_ = fVar155 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar158,auVar8,auVar242);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar9 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar8 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar220 = auVar62._0_4_;
  auVar142._0_4_ = fVar220 * auVar8._0_4_;
  fVar128 = auVar62._4_4_;
  auVar142._4_4_ = fVar128 * auVar8._4_4_;
  fVar129 = auVar62._8_4_;
  auVar142._8_4_ = fVar129 * auVar8._8_4_;
  fVar139 = auVar62._12_4_;
  auVar142._12_4_ = fVar139 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar142,auVar9,auVar12);
  auVar12 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar13 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar8 = vdpps_avx(auVar121,auVar121,0x7f);
  auVar179._0_4_ = fVar220 * auVar13._0_4_;
  auVar179._4_4_ = fVar128 * auVar13._4_4_;
  auVar179._8_4_ = fVar129 * auVar13._8_4_;
  auVar179._12_4_ = fVar139 * auVar13._12_4_;
  auVar9 = vfmsub231ps_fma(auVar179,auVar9,auVar61);
  auVar13 = vshufps_avx(auVar9,auVar9,0xc9);
  fVar82 = auVar8._0_4_;
  auVar223._4_12_ = ZEXT812(0) << 0x20;
  auVar223._0_4_ = fVar82;
  auVar9 = vrsqrtss_avx(auVar223,auVar223);
  fVar58 = auVar9._0_4_;
  fVar84 = fVar58 * 1.5 - fVar82 * 0.5 * fVar58 * fVar58 * fVar58;
  auVar9 = vdpps_avx(auVar121,auVar11,0x7f);
  fVar154 = auVar121._0_4_ * fVar84;
  fVar174 = auVar121._4_4_ * fVar84;
  fVar175 = auVar121._8_4_ * fVar84;
  fVar176 = auVar121._12_4_ * fVar84;
  auVar234._0_4_ = auVar11._0_4_ * fVar82;
  auVar234._4_4_ = auVar11._4_4_ * fVar82;
  auVar234._8_4_ = auVar11._8_4_ * fVar82;
  auVar234._12_4_ = auVar11._12_4_ * fVar82;
  fVar58 = auVar9._0_4_;
  auVar194._0_4_ = auVar121._0_4_ * fVar58;
  auVar194._4_4_ = auVar121._4_4_ * fVar58;
  auVar194._8_4_ = auVar121._8_4_ * fVar58;
  auVar194._12_4_ = auVar121._12_4_ * fVar58;
  auVar121 = vsubps_avx(auVar234,auVar194);
  auVar9 = vrcpss_avx(auVar223,auVar223);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar58 = auVar9._0_4_ * auVar8._0_4_;
  auVar8 = vdpps_avx(auVar12,auVar12,0x7f);
  fVar82 = auVar8._0_4_;
  auVar224._4_12_ = ZEXT812(0) << 0x20;
  auVar224._0_4_ = fVar82;
  auVar9 = vrsqrtss_avx(auVar224,auVar224);
  fVar115 = auVar9._0_4_;
  fVar115 = fVar115 * 1.5 - fVar82 * 0.5 * fVar115 * fVar115 * fVar115;
  auVar9 = vdpps_avx(auVar12,auVar13,0x7f);
  fVar251 = fVar115 * auVar12._0_4_;
  fVar261 = fVar115 * auVar12._4_4_;
  fVar262 = fVar115 * auVar12._8_4_;
  fVar263 = fVar115 * auVar12._12_4_;
  auVar180._0_4_ = fVar82 * auVar13._0_4_;
  auVar180._4_4_ = fVar82 * auVar13._4_4_;
  auVar180._8_4_ = fVar82 * auVar13._8_4_;
  auVar180._12_4_ = fVar82 * auVar13._12_4_;
  fVar82 = auVar9._0_4_;
  auVar143._0_4_ = fVar82 * auVar12._0_4_;
  auVar143._4_4_ = fVar82 * auVar12._4_4_;
  auVar143._8_4_ = fVar82 * auVar12._8_4_;
  auVar143._12_4_ = fVar82 * auVar12._12_4_;
  auVar11 = vsubps_avx(auVar180,auVar143);
  auVar9 = vrcpss_avx(auVar224,auVar224);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,ZEXT416(0x40000000));
  fVar82 = auVar8._0_4_ * auVar9._0_4_;
  auVar8 = vshufps_avx(_local_7a0,_local_7a0,0xff);
  auVar207._0_4_ = auVar8._0_4_ * fVar154;
  auVar207._4_4_ = auVar8._4_4_ * fVar174;
  auVar207._8_4_ = auVar8._8_4_ * fVar175;
  auVar207._12_4_ = auVar8._12_4_ * fVar176;
  local_540 = vsubps_avx(_local_7a0,auVar207);
  auVar9 = vshufps_avx(auVar88,auVar88,0xff);
  auVar159._0_4_ = auVar9._0_4_ * fVar154 + fVar84 * auVar121._0_4_ * fVar58 * auVar8._0_4_;
  auVar159._4_4_ = auVar9._4_4_ * fVar174 + fVar84 * auVar121._4_4_ * fVar58 * auVar8._4_4_;
  auVar159._8_4_ = auVar9._8_4_ * fVar175 + fVar84 * auVar121._8_4_ * fVar58 * auVar8._8_4_;
  auVar159._12_4_ = auVar9._12_4_ * fVar176 + fVar84 * auVar121._12_4_ * fVar58 * auVar8._12_4_;
  auVar121 = vsubps_avx(auVar88,auVar159);
  local_550._0_4_ = auVar207._0_4_ + (float)local_7a0._0_4_;
  local_550._4_4_ = auVar207._4_4_ + (float)local_7a0._4_4_;
  fStack_548 = auVar207._8_4_ + (float)uStack_798;
  fStack_544 = auVar207._12_4_ + uStack_798._4_4_;
  auVar8 = vshufps_avx(auVar87,auVar87,0xff);
  auVar107._0_4_ = fVar251 * auVar8._0_4_;
  auVar107._4_4_ = fVar261 * auVar8._4_4_;
  auVar107._8_4_ = fVar262 * auVar8._8_4_;
  auVar107._12_4_ = fVar263 * auVar8._12_4_;
  local_560 = vsubps_avx(auVar87,auVar107);
  auVar9 = vshufps_avx(auVar62,auVar62,0xff);
  auVar90._0_4_ = fVar251 * auVar9._0_4_ + auVar8._0_4_ * fVar115 * auVar11._0_4_ * fVar82;
  auVar90._4_4_ = fVar261 * auVar9._4_4_ + auVar8._4_4_ * fVar115 * auVar11._4_4_ * fVar82;
  auVar90._8_4_ = fVar262 * auVar9._8_4_ + auVar8._8_4_ * fVar115 * auVar11._8_4_ * fVar82;
  auVar90._12_4_ = fVar263 * auVar9._12_4_ + auVar8._12_4_ * fVar115 * auVar11._12_4_ * fVar82;
  auVar8 = vsubps_avx(auVar62,auVar90);
  fVar154 = auVar87._0_4_ + auVar107._0_4_;
  fVar174 = auVar87._4_4_ + auVar107._4_4_;
  fVar175 = auVar87._8_4_ + auVar107._8_4_;
  fVar176 = auVar87._12_4_ + auVar107._12_4_;
  local_570._0_4_ = local_540._0_4_ + auVar121._0_4_ * 0.33333334;
  local_570._4_4_ = local_540._4_4_ + auVar121._4_4_ * 0.33333334;
  local_570._8_4_ = local_540._8_4_ + auVar121._8_4_ * 0.33333334;
  local_570._12_4_ = local_540._12_4_ + auVar121._12_4_ * 0.33333334;
  auVar91._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar91._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar91._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar91._12_4_ = auVar8._12_4_ * 0.33333334;
  local_580 = vsubps_avx(local_560,auVar91);
  local_520 = vsubps_avx(local_540,auVar106);
  auVar8 = vshufps_avx(local_520,local_520,0x55);
  auVar9 = vshufps_avx(local_520,local_520,0xaa);
  aVar1 = pre->ray_space[k].vy.field_0;
  fVar58 = pre->ray_space[k].vz.field_0.m128[0];
  fVar82 = pre->ray_space[k].vz.field_0.m128[1];
  fVar84 = pre->ray_space[k].vz.field_0.m128[2];
  fVar115 = pre->ray_space[k].vz.field_0.m128[3];
  auVar92._0_4_ = fVar58 * auVar9._0_4_;
  auVar92._4_4_ = fVar82 * auVar9._4_4_;
  auVar92._8_4_ = fVar84 * auVar9._8_4_;
  auVar92._12_4_ = fVar115 * auVar9._12_4_;
  auVar121 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar1,auVar8);
  local_530 = vsubps_avx(local_570,auVar106);
  auVar8 = vshufps_avx(local_530,local_530,0x55);
  auVar9 = vshufps_avx(local_530,local_530,0xaa);
  auVar272._0_4_ = fVar58 * auVar9._0_4_;
  auVar272._4_4_ = fVar82 * auVar9._4_4_;
  auVar272._8_4_ = fVar84 * auVar9._8_4_;
  auVar272._12_4_ = fVar115 * auVar9._12_4_;
  auVar9 = vfmadd231ps_fma(auVar272,(undefined1  [16])aVar1,auVar8);
  local_3e0 = vsubps_avx(local_580,auVar106);
  auVar8 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar240._0_4_ = fVar58 * auVar8._0_4_;
  auVar240._4_4_ = fVar82 * auVar8._4_4_;
  auVar240._8_4_ = fVar84 * auVar8._8_4_;
  auVar240._12_4_ = fVar115 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar11 = vfmadd231ps_fma(auVar240,(undefined1  [16])aVar1,auVar8);
  local_3f0 = vsubps_avx(local_560,auVar106);
  auVar8 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar253._0_4_ = fVar58 * auVar8._0_4_;
  auVar253._4_4_ = fVar82 * auVar8._4_4_;
  auVar253._8_4_ = fVar84 * auVar8._8_4_;
  auVar253._12_4_ = fVar115 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar12 = vfmadd231ps_fma(auVar253,(undefined1  [16])aVar1,auVar8);
  local_400 = vsubps_avx(_local_550,auVar106);
  auVar8 = vshufps_avx(local_400,local_400,0xaa);
  auVar144._0_4_ = fVar58 * auVar8._0_4_;
  auVar144._4_4_ = fVar82 * auVar8._4_4_;
  auVar144._8_4_ = fVar84 * auVar8._8_4_;
  auVar144._12_4_ = fVar115 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_400,local_400,0x55);
  auVar13 = vfmadd231ps_fma(auVar144,(undefined1  [16])aVar1,auVar8);
  local_590._0_4_ = (fVar83 + auVar159._0_4_) * 0.33333334 + (float)local_550._0_4_;
  local_590._4_4_ = (fVar85 + auVar159._4_4_) * 0.33333334 + (float)local_550._4_4_;
  fStack_588 = (fVar59 + auVar159._8_4_) * 0.33333334 + fStack_548;
  fStack_584 = (fVar155 + auVar159._12_4_) * 0.33333334 + fStack_544;
  local_410 = vsubps_avx(_local_590,auVar106);
  auVar8 = vshufps_avx(local_410,local_410,0xaa);
  auVar195._0_4_ = auVar8._0_4_ * fVar58;
  auVar195._4_4_ = auVar8._4_4_ * fVar82;
  auVar195._8_4_ = auVar8._8_4_ * fVar84;
  auVar195._12_4_ = auVar8._12_4_ * fVar115;
  auVar8 = vshufps_avx(local_410,local_410,0x55);
  auVar62 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar1,auVar8);
  auVar208._0_4_ = (fVar220 + auVar90._0_4_) * 0.33333334;
  auVar208._4_4_ = (fVar128 + auVar90._4_4_) * 0.33333334;
  auVar208._8_4_ = (fVar129 + auVar90._8_4_) * 0.33333334;
  auVar208._12_4_ = (fVar139 + auVar90._12_4_) * 0.33333334;
  auVar42._4_4_ = fVar174;
  auVar42._0_4_ = fVar154;
  auVar42._8_4_ = fVar175;
  auVar42._12_4_ = fVar176;
  _local_5a0 = vsubps_avx(auVar42,auVar208);
  local_420 = vsubps_avx(_local_5a0,auVar106);
  auVar8 = vshufps_avx(local_420,local_420,0xaa);
  auVar209._0_4_ = auVar8._0_4_ * fVar58;
  auVar209._4_4_ = auVar8._4_4_ * fVar82;
  auVar209._8_4_ = auVar8._8_4_ * fVar84;
  auVar209._12_4_ = auVar8._12_4_ * fVar115;
  auVar8 = vshufps_avx(local_420,local_420,0x55);
  auVar61 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar1,auVar8);
  local_430 = vsubps_avx(auVar42,auVar106);
  auVar8 = vshufps_avx(local_430,local_430,0xaa);
  auVar63._0_4_ = fVar58 * auVar8._0_4_;
  auVar63._4_4_ = fVar82 * auVar8._4_4_;
  auVar63._8_4_ = fVar84 * auVar8._8_4_;
  auVar63._12_4_ = fVar115 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_430,local_430,0x55);
  auVar8 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar1,auVar8);
  auVar160._4_4_ = local_520._0_4_;
  auVar160._0_4_ = local_520._0_4_;
  auVar160._8_4_ = local_520._0_4_;
  auVar160._12_4_ = local_520._0_4_;
  aVar1 = pre->ray_space[k].vx.field_0;
  auVar106 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar1,auVar160);
  auVar161._4_4_ = local_530._0_4_;
  auVar161._0_4_ = local_530._0_4_;
  auVar161._8_4_ = local_530._0_4_;
  auVar161._12_4_ = local_530._0_4_;
  auVar87 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar1,auVar161);
  uVar57 = local_3e0._0_4_;
  auVar162._4_4_ = uVar57;
  auVar162._0_4_ = uVar57;
  auVar162._8_4_ = uVar57;
  auVar162._12_4_ = uVar57;
  auVar242 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar1,auVar162);
  uVar57 = local_3f0._0_4_;
  auVar163._4_4_ = uVar57;
  auVar163._0_4_ = uVar57;
  auVar163._8_4_ = uVar57;
  auVar163._12_4_ = uVar57;
  auVar88 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar1,auVar163);
  uVar57 = local_400._0_4_;
  auVar164._4_4_ = uVar57;
  auVar164._0_4_ = uVar57;
  auVar164._8_4_ = uVar57;
  auVar164._12_4_ = uVar57;
  auVar116 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar1,auVar164);
  uVar57 = local_410._0_4_;
  auVar165._4_4_ = uVar57;
  auVar165._0_4_ = uVar57;
  auVar165._8_4_ = uVar57;
  auVar165._12_4_ = uVar57;
  auVar62 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar165);
  uVar57 = local_420._0_4_;
  auVar166._4_4_ = uVar57;
  auVar166._0_4_ = uVar57;
  auVar166._8_4_ = uVar57;
  auVar166._12_4_ = uVar57;
  auVar61 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar166);
  uVar57 = local_430._0_4_;
  auVar167._4_4_ = uVar57;
  auVar167._0_4_ = uVar57;
  auVar167._8_4_ = uVar57;
  auVar167._12_4_ = uVar57;
  auVar131 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar167);
  auVar11 = vmovlhps_avx(auVar106,auVar116);
  auVar12 = vmovlhps_avx(auVar87,auVar62);
  auVar13 = vmovlhps_avx(auVar242,auVar61);
  _local_3c0 = vmovlhps_avx(auVar88,auVar131);
  auVar8 = vminps_avx(auVar11,auVar12);
  auVar9 = vminps_avx(auVar13,_local_3c0);
  auVar121 = vminps_avx(auVar8,auVar9);
  auVar8 = vmaxps_avx(auVar11,auVar12);
  auVar9 = vmaxps_avx(auVar13,_local_3c0);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vshufpd_avx(auVar121,auVar121,3);
  auVar121 = vminps_avx(auVar121,auVar9);
  auVar9 = vshufpd_avx(auVar8,auVar8,3);
  auVar9 = vmaxps_avx(auVar8,auVar9);
  auVar8 = vandps_avx(local_500,auVar121);
  auVar9 = vandps_avx(local_500,auVar9);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar9,auVar8);
  local_1c0 = auVar8._0_4_ * 9.536743e-07;
  auVar181._8_8_ = auVar106._0_8_;
  auVar181._0_8_ = auVar106._0_8_;
  auVar225._8_8_ = auVar87._0_8_;
  auVar225._0_8_ = auVar87._0_8_;
  auVar241._0_8_ = auVar242._0_8_;
  auVar241._8_8_ = auVar241._0_8_;
  auVar254._0_8_ = auVar88._0_8_;
  auVar254._8_8_ = auVar254._0_8_;
  local_3d0 = ZEXT416((uint)local_1c0);
  local_510 = 0x80000000;
  uStack_50c = 0x80000000;
  uStack_508 = 0x80000000;
  uStack_504 = 0x80000000;
  fStack_1bc = local_1c0;
  fStack_1b8 = local_1c0;
  fStack_1b4 = local_1c0;
  fStack_1b0 = local_1c0;
  fStack_1ac = local_1c0;
  fStack_1a8 = local_1c0;
  fStack_1a4 = local_1c0;
  fStack_1d8 = -local_1c0;
  local_1e0 = -local_1c0;
  fStack_1dc = -local_1c0;
  fStack_1d4 = fStack_1d8;
  fStack_1d0 = fStack_1d8;
  fStack_1cc = fStack_1d8;
  fStack_1c8 = fStack_1d8;
  fStack_1c4 = fStack_1d8;
  local_320 = uVar48;
  uStack_31c = uVar48;
  uStack_318 = uVar48;
  uStack_314 = uVar48;
  uStack_310 = uVar48;
  uStack_30c = uVar48;
  uStack_308 = uVar48;
  uStack_304 = uVar48;
  local_340 = uVar3;
  uStack_33c = uVar3;
  uStack_338 = uVar3;
  uStack_334 = uVar3;
  uStack_330 = uVar3;
  uStack_32c = uVar3;
  uStack_328 = uVar3;
  uStack_324 = uVar3;
  uVar56 = 0;
  fVar58 = *(float *)(ray + k * 4 + 0x60);
  local_390 = vsubps_avx(auVar12,auVar11);
  local_3a0 = vsubps_avx(auVar13,auVar12);
  local_3b0 = vsubps_avx(_local_3c0,auVar13);
  local_450 = vsubps_avx(_local_550,local_540);
  local_460 = vsubps_avx(_local_590,local_570);
  local_470 = vsubps_avx(_local_5a0,local_580);
  auVar43._4_4_ = fVar174;
  auVar43._0_4_ = fVar154;
  auVar43._8_4_ = fVar175;
  auVar43._12_4_ = fVar176;
  _local_480 = vsubps_avx(auVar43,local_560);
  auVar64 = ZEXT816(0x3f80000000000000);
  local_440 = auVar64;
LAB_0110c69e:
  auVar8 = vshufps_avx(auVar64,auVar64,0x50);
  auVar273._8_4_ = 0x3f800000;
  auVar273._0_8_ = 0x3f8000003f800000;
  auVar273._12_4_ = 0x3f800000;
  auVar276._16_4_ = 0x3f800000;
  auVar276._0_16_ = auVar273;
  auVar276._20_4_ = 0x3f800000;
  auVar276._24_4_ = 0x3f800000;
  auVar276._28_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar273,auVar8);
  fVar82 = auVar8._0_4_;
  fVar129 = auVar116._0_4_;
  auVar65._0_4_ = fVar129 * fVar82;
  fVar84 = auVar8._4_4_;
  fVar139 = auVar116._4_4_;
  auVar65._4_4_ = fVar139 * fVar84;
  fVar115 = auVar8._8_4_;
  auVar65._8_4_ = fVar129 * fVar115;
  fVar83 = auVar8._12_4_;
  auVar65._12_4_ = fVar139 * fVar83;
  fVar251 = auVar62._0_4_;
  auVar168._0_4_ = fVar251 * fVar82;
  fVar261 = auVar62._4_4_;
  auVar168._4_4_ = fVar261 * fVar84;
  auVar168._8_4_ = fVar251 * fVar115;
  auVar168._12_4_ = fVar261 * fVar83;
  fVar193 = auVar61._0_4_;
  auVar133._0_4_ = fVar193 * fVar82;
  fVar203 = auVar61._4_4_;
  auVar133._4_4_ = fVar203 * fVar84;
  auVar133._8_4_ = fVar193 * fVar115;
  auVar133._12_4_ = fVar203 * fVar83;
  fVar204 = auVar131._0_4_;
  auVar108._0_4_ = fVar204 * fVar82;
  fVar219 = auVar131._4_4_;
  auVar108._4_4_ = fVar219 * fVar84;
  auVar108._8_4_ = fVar204 * fVar115;
  auVar108._12_4_ = fVar219 * fVar83;
  auVar87 = vfmadd231ps_fma(auVar65,auVar9,auVar181);
  auVar242 = vfmadd231ps_fma(auVar168,auVar9,auVar225);
  auVar88 = vfmadd231ps_fma(auVar133,auVar9,auVar241);
  auVar60 = vfmadd231ps_fma(auVar108,auVar254,auVar9);
  auVar8 = vmovshdup_avx(local_440);
  fVar82 = local_440._0_4_;
  fStack_288 = (auVar8._0_4_ - fVar82) * 0.04761905;
  auVar217._4_4_ = fVar82;
  auVar217._0_4_ = fVar82;
  auVar217._8_4_ = fVar82;
  auVar217._12_4_ = fVar82;
  auVar217._16_4_ = fVar82;
  auVar217._20_4_ = fVar82;
  auVar217._24_4_ = fVar82;
  auVar217._28_4_ = fVar82;
  auVar102._0_8_ = auVar8._0_8_;
  auVar102._8_8_ = auVar102._0_8_;
  auVar102._16_8_ = auVar102._0_8_;
  auVar102._24_8_ = auVar102._0_8_;
  auVar77 = vsubps_avx(auVar102,auVar217);
  uVar57 = auVar87._0_4_;
  auVar270._4_4_ = uVar57;
  auVar270._0_4_ = uVar57;
  auVar270._8_4_ = uVar57;
  auVar270._12_4_ = uVar57;
  auVar270._16_4_ = uVar57;
  auVar270._20_4_ = uVar57;
  auVar270._24_4_ = uVar57;
  auVar270._28_4_ = uVar57;
  auVar8 = vmovshdup_avx(auVar87);
  uVar86 = auVar8._0_8_;
  auVar260._8_8_ = uVar86;
  auVar260._0_8_ = uVar86;
  auVar260._16_8_ = uVar86;
  auVar260._24_8_ = uVar86;
  fVar128 = auVar242._0_4_;
  auVar248._4_4_ = fVar128;
  auVar248._0_4_ = fVar128;
  auVar248._8_4_ = fVar128;
  auVar248._12_4_ = fVar128;
  auVar248._16_4_ = fVar128;
  auVar248._20_4_ = fVar128;
  auVar248._24_4_ = fVar128;
  auVar248._28_4_ = fVar128;
  auVar9 = vmovshdup_avx(auVar242);
  auVar103._0_8_ = auVar9._0_8_;
  auVar103._8_8_ = auVar103._0_8_;
  auVar103._16_8_ = auVar103._0_8_;
  auVar103._24_8_ = auVar103._0_8_;
  fVar220 = auVar88._0_4_;
  auVar185._4_4_ = fVar220;
  auVar185._0_4_ = fVar220;
  auVar185._8_4_ = fVar220;
  auVar185._12_4_ = fVar220;
  auVar185._16_4_ = fVar220;
  auVar185._20_4_ = fVar220;
  auVar185._24_4_ = fVar220;
  auVar185._28_4_ = fVar220;
  auVar121 = vmovshdup_avx(auVar88);
  auVar201._0_8_ = auVar121._0_8_;
  auVar201._8_8_ = auVar201._0_8_;
  auVar201._16_8_ = auVar201._0_8_;
  auVar201._24_8_ = auVar201._0_8_;
  fVar155 = auVar60._0_4_;
  auVar106 = vmovshdup_avx(auVar60);
  auVar235 = vfmadd132ps_fma(auVar77,auVar217,_DAT_01f7b040);
  auVar77 = vsubps_avx(auVar276,ZEXT1632(auVar235));
  fVar82 = auVar235._0_4_;
  fVar84 = auVar235._4_4_;
  auVar15._4_4_ = fVar128 * fVar84;
  auVar15._0_4_ = fVar128 * fVar82;
  fVar115 = auVar235._8_4_;
  auVar15._8_4_ = fVar128 * fVar115;
  fVar83 = auVar235._12_4_;
  auVar15._12_4_ = fVar128 * fVar83;
  auVar15._16_4_ = fVar128 * 0.0;
  auVar15._20_4_ = fVar128 * 0.0;
  auVar15._24_4_ = fVar128 * 0.0;
  auVar15._28_4_ = 0x3f800000;
  auVar235 = vfmadd231ps_fma(auVar15,auVar77,auVar270);
  fVar85 = auVar9._0_4_;
  fVar59 = auVar9._4_4_;
  auVar14._4_4_ = fVar59 * fVar84;
  auVar14._0_4_ = fVar85 * fVar82;
  auVar14._8_4_ = fVar85 * fVar115;
  auVar14._12_4_ = fVar59 * fVar83;
  auVar14._16_4_ = fVar85 * 0.0;
  auVar14._20_4_ = fVar59 * 0.0;
  auVar14._24_4_ = fVar85 * 0.0;
  auVar14._28_4_ = uVar57;
  auVar130 = vfmadd231ps_fma(auVar14,auVar77,auVar260);
  auVar10._4_4_ = fVar220 * fVar84;
  auVar10._0_4_ = fVar220 * fVar82;
  auVar10._8_4_ = fVar220 * fVar115;
  auVar10._12_4_ = fVar220 * fVar83;
  auVar10._16_4_ = fVar220 * 0.0;
  auVar10._20_4_ = fVar220 * 0.0;
  auVar10._24_4_ = fVar220 * 0.0;
  auVar10._28_4_ = auVar8._4_4_;
  auVar140 = vfmadd231ps_fma(auVar10,auVar77,auVar248);
  fVar85 = auVar121._0_4_;
  fVar59 = auVar121._4_4_;
  auVar16._4_4_ = fVar59 * fVar84;
  auVar16._0_4_ = fVar85 * fVar82;
  auVar16._8_4_ = fVar85 * fVar115;
  auVar16._12_4_ = fVar59 * fVar83;
  auVar16._16_4_ = fVar85 * 0.0;
  auVar16._20_4_ = fVar59 * 0.0;
  auVar16._24_4_ = fVar85 * 0.0;
  auVar16._28_4_ = fVar128;
  auVar118 = vfmadd231ps_fma(auVar16,auVar77,auVar103);
  auVar8 = vshufps_avx(auVar87,auVar87,0xaa);
  local_720._8_8_ = auVar8._0_8_;
  local_720._0_8_ = local_720._8_8_;
  local_720._16_8_ = local_720._8_8_;
  local_720._24_8_ = local_720._8_8_;
  auVar9 = vshufps_avx(auVar87,auVar87,0xff);
  uStack_798 = auVar9._0_8_;
  local_7a0 = (undefined1  [8])uStack_798;
  uStack_790 = uStack_798;
  uStack_788 = uStack_798;
  auVar17._4_4_ = fVar155 * fVar84;
  auVar17._0_4_ = fVar155 * fVar82;
  auVar17._8_4_ = fVar155 * fVar115;
  auVar17._12_4_ = fVar155 * fVar83;
  auVar17._16_4_ = fVar155 * 0.0;
  auVar17._20_4_ = fVar155 * 0.0;
  auVar17._24_4_ = fVar155 * 0.0;
  auVar17._28_4_ = fVar155;
  auVar87 = vfmadd231ps_fma(auVar17,auVar77,auVar185);
  auVar9 = vshufps_avx(auVar242,auVar242,0xaa);
  auVar186._0_8_ = auVar9._0_8_;
  auVar186._8_8_ = auVar186._0_8_;
  auVar186._16_8_ = auVar186._0_8_;
  auVar186._24_8_ = auVar186._0_8_;
  auVar121 = vshufps_avx(auVar242,auVar242,0xff);
  local_620._8_8_ = auVar121._0_8_;
  local_620._0_8_ = local_620._8_8_;
  local_620._16_8_ = local_620._8_8_;
  local_620._24_8_ = local_620._8_8_;
  fVar85 = auVar106._0_4_;
  fVar59 = auVar106._4_4_;
  auVar18._4_4_ = fVar59 * fVar84;
  auVar18._0_4_ = fVar85 * fVar82;
  auVar18._8_4_ = fVar85 * fVar115;
  auVar18._12_4_ = fVar59 * fVar83;
  auVar18._16_4_ = fVar85 * 0.0;
  auVar18._20_4_ = fVar59 * 0.0;
  auVar18._24_4_ = fVar85 * 0.0;
  auVar18._28_4_ = auVar8._4_4_;
  auVar141 = vfmadd231ps_fma(auVar18,auVar77,auVar201);
  auVar250._28_4_ = fVar59;
  auVar250._0_28_ =
       ZEXT1628(CONCAT412(auVar140._12_4_ * fVar83,
                          CONCAT48(auVar140._8_4_ * fVar115,
                                   CONCAT44(auVar140._4_4_ * fVar84,auVar140._0_4_ * fVar82))));
  auVar235 = vfmadd231ps_fma(auVar250,auVar77,ZEXT1632(auVar235));
  fVar85 = auVar121._4_4_;
  auVar19._28_4_ = fVar85;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar118._12_4_ * fVar83,
                          CONCAT48(auVar118._8_4_ * fVar115,
                                   CONCAT44(auVar118._4_4_ * fVar84,auVar118._0_4_ * fVar82))));
  auVar130 = vfmadd231ps_fma(auVar19,auVar77,ZEXT1632(auVar130));
  auVar8 = vshufps_avx(auVar88,auVar88,0xaa);
  uVar86 = auVar8._0_8_;
  auVar173._8_8_ = uVar86;
  auVar173._0_8_ = uVar86;
  auVar173._16_8_ = uVar86;
  auVar173._24_8_ = uVar86;
  auVar106 = vshufps_avx(auVar88,auVar88,0xff);
  uVar86 = auVar106._0_8_;
  auVar277._8_8_ = uVar86;
  auVar277._0_8_ = uVar86;
  auVar277._16_8_ = uVar86;
  auVar277._24_8_ = uVar86;
  auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar87._12_4_ * fVar83,
                                               CONCAT48(auVar87._8_4_ * fVar115,
                                                        CONCAT44(auVar87._4_4_ * fVar84,
                                                                 auVar87._0_4_ * fVar82)))),auVar77,
                            ZEXT1632(auVar140));
  auVar87 = vshufps_avx(auVar60,auVar60,0xaa);
  auVar242 = vshufps_avx(auVar60,auVar60,0xff);
  auVar60 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar83 * auVar141._12_4_,
                                               CONCAT48(fVar115 * auVar141._8_4_,
                                                        CONCAT44(fVar84 * auVar141._4_4_,
                                                                 fVar82 * auVar141._0_4_)))),auVar77
                            ,ZEXT1632(auVar118));
  auVar140 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar83 * auVar88._12_4_,
                                                CONCAT48(fVar115 * auVar88._8_4_,
                                                         CONCAT44(fVar84 * auVar88._4_4_,
                                                                  fVar82 * auVar88._0_4_)))),auVar77
                             ,ZEXT1632(auVar235));
  auVar15 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar235));
  auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar83 * auVar60._12_4_,
                                               CONCAT48(fVar115 * auVar60._8_4_,
                                                        CONCAT44(fVar84 * auVar60._4_4_,
                                                                 fVar82 * auVar60._0_4_)))),auVar77,
                            ZEXT1632(auVar130));
  auVar78 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar130));
  fVar59 = auVar78._28_4_;
  auVar249._0_4_ = fStack_288 * auVar15._0_4_ * 3.0;
  auVar249._4_4_ = fStack_288 * auVar15._4_4_ * 3.0;
  auVar249._8_4_ = fStack_288 * auVar15._8_4_ * 3.0;
  auVar249._12_4_ = fStack_288 * auVar15._12_4_ * 3.0;
  auVar249._16_4_ = fStack_288 * auVar15._16_4_ * 3.0;
  auVar249._20_4_ = fStack_288 * auVar15._20_4_ * 3.0;
  auVar249._24_4_ = fStack_288 * auVar15._24_4_ * 3.0;
  auVar249._28_4_ = 0;
  local_5c0._0_4_ = fStack_288 * auVar78._0_4_ * 3.0;
  local_5c0._4_4_ = fStack_288 * auVar78._4_4_ * 3.0;
  fStack_5b8 = fStack_288 * auVar78._8_4_ * 3.0;
  fStack_5b4 = fStack_288 * auVar78._12_4_ * 3.0;
  fStack_5b0 = fStack_288 * auVar78._16_4_ * 3.0;
  fStack_5ac = fStack_288 * auVar78._20_4_ * 3.0;
  fStack_5a8 = fStack_288 * auVar78._24_4_ * 3.0;
  fStack_5a4 = fVar59;
  fVar155 = auVar9._0_4_;
  fVar220 = auVar9._4_4_;
  auVar20._4_4_ = fVar220 * fVar84;
  auVar20._0_4_ = fVar155 * fVar82;
  auVar20._8_4_ = fVar155 * fVar115;
  auVar20._12_4_ = fVar220 * fVar83;
  auVar20._16_4_ = fVar155 * 0.0;
  auVar20._20_4_ = fVar220 * 0.0;
  auVar20._24_4_ = fVar155 * 0.0;
  auVar20._28_4_ = fVar59;
  auVar9 = vfmadd231ps_fma(auVar20,auVar77,local_720);
  fVar155 = auVar121._0_4_;
  auVar21._4_4_ = fVar85 * fVar84;
  auVar21._0_4_ = fVar155 * fVar82;
  auVar21._8_4_ = fVar155 * fVar115;
  auVar21._12_4_ = fVar85 * fVar83;
  auVar21._16_4_ = fVar155 * 0.0;
  auVar21._20_4_ = fVar85 * 0.0;
  auVar21._24_4_ = fVar155 * 0.0;
  auVar21._28_4_ = 0;
  auVar121 = vfmadd231ps_fma(auVar21,auVar77,_local_7a0);
  fVar85 = auVar8._0_4_;
  fVar155 = auVar8._4_4_;
  auVar22._4_4_ = fVar155 * fVar84;
  auVar22._0_4_ = fVar85 * fVar82;
  auVar22._8_4_ = fVar85 * fVar115;
  auVar22._12_4_ = fVar155 * fVar83;
  auVar22._16_4_ = fVar85 * 0.0;
  auVar22._20_4_ = fVar155 * 0.0;
  auVar22._24_4_ = fVar85 * 0.0;
  auVar22._28_4_ = auVar15._28_4_;
  auVar8 = vfmadd231ps_fma(auVar22,auVar77,auVar186);
  fVar85 = auVar106._0_4_;
  fVar128 = auVar106._4_4_;
  auVar23._4_4_ = fVar128 * fVar84;
  auVar23._0_4_ = fVar85 * fVar82;
  auVar23._8_4_ = fVar85 * fVar115;
  auVar23._12_4_ = fVar128 * fVar83;
  auVar23._16_4_ = fVar85 * 0.0;
  auVar23._20_4_ = fVar128 * 0.0;
  auVar23._24_4_ = fVar85 * 0.0;
  auVar23._28_4_ = fVar220;
  auVar106 = vfmadd231ps_fma(auVar23,auVar77,local_620);
  auVar16 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar140));
  fVar85 = auVar87._0_4_;
  fVar155 = auVar87._4_4_;
  auVar24._4_4_ = fVar155 * fVar84;
  auVar24._0_4_ = fVar85 * fVar82;
  auVar24._8_4_ = fVar85 * fVar115;
  auVar24._12_4_ = fVar155 * fVar83;
  auVar24._16_4_ = fVar85 * 0.0;
  auVar24._20_4_ = fVar155 * 0.0;
  auVar24._24_4_ = fVar85 * 0.0;
  auVar24._28_4_ = fVar155;
  auVar87 = vfmadd231ps_fma(auVar24,auVar77,auVar173);
  auVar17 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar88));
  fVar85 = auVar242._0_4_;
  fVar155 = auVar242._4_4_;
  auVar25._4_4_ = fVar155 * fVar84;
  auVar25._0_4_ = fVar85 * fVar82;
  auVar25._8_4_ = fVar85 * fVar115;
  auVar25._12_4_ = fVar155 * fVar83;
  auVar25._16_4_ = fVar85 * 0.0;
  auVar25._20_4_ = fVar155 * 0.0;
  auVar25._24_4_ = fVar85 * 0.0;
  auVar25._28_4_ = fVar155;
  auVar242 = vfmadd231ps_fma(auVar25,auVar77,auVar277);
  auVar26._28_4_ = fVar128;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar8._12_4_ * fVar83,
                          CONCAT48(auVar8._8_4_ * fVar115,
                                   CONCAT44(auVar8._4_4_ * fVar84,auVar8._0_4_ * fVar82))));
  auVar9 = vfmadd231ps_fma(auVar26,auVar77,ZEXT1632(auVar9));
  auVar121 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar83 * auVar106._12_4_,
                                                CONCAT48(fVar115 * auVar106._8_4_,
                                                         CONCAT44(fVar84 * auVar106._4_4_,
                                                                  fVar82 * auVar106._0_4_)))),
                             auVar77,ZEXT1632(auVar121));
  auVar104._0_4_ = auVar140._0_4_ + auVar249._0_4_;
  auVar104._4_4_ = auVar140._4_4_ + auVar249._4_4_;
  auVar104._8_4_ = auVar140._8_4_ + auVar249._8_4_;
  auVar104._12_4_ = auVar140._12_4_ + auVar249._12_4_;
  auVar104._16_4_ = auVar249._16_4_ + 0.0;
  auVar104._20_4_ = auVar249._20_4_ + 0.0;
  auVar104._24_4_ = auVar249._24_4_ + 0.0;
  auVar104._28_4_ = 0;
  auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar87._12_4_ * fVar83,
                                              CONCAT48(auVar87._8_4_ * fVar115,
                                                       CONCAT44(auVar87._4_4_ * fVar84,
                                                                auVar87._0_4_ * fVar82)))),auVar77,
                           ZEXT1632(auVar8));
  auVar106 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar242._12_4_ * fVar83,
                                                CONCAT48(auVar242._8_4_ * fVar115,
                                                         CONCAT44(auVar242._4_4_ * fVar84,
                                                                  auVar242._0_4_ * fVar82)))),
                             auVar77,ZEXT1632(auVar106));
  auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar83 * auVar8._12_4_,
                                               CONCAT48(fVar115 * auVar8._8_4_,
                                                        CONCAT44(fVar84 * auVar8._4_4_,
                                                                 fVar82 * auVar8._0_4_)))),auVar77,
                            ZEXT1632(auVar9));
  auVar242 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar106._12_4_ * fVar83,
                                                CONCAT48(auVar106._8_4_ * fVar115,
                                                         CONCAT44(auVar106._4_4_ * fVar84,
                                                                  auVar106._0_4_ * fVar82)))),
                             ZEXT1632(auVar121),auVar77);
  auVar77 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar15 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar121));
  auVar271._0_4_ = fStack_288 * auVar77._0_4_ * 3.0;
  auVar271._4_4_ = fStack_288 * auVar77._4_4_ * 3.0;
  auVar271._8_4_ = fStack_288 * auVar77._8_4_ * 3.0;
  auVar271._12_4_ = fStack_288 * auVar77._12_4_ * 3.0;
  auVar271._16_4_ = fStack_288 * auVar77._16_4_ * 3.0;
  auVar271._20_4_ = fStack_288 * auVar77._20_4_ * 3.0;
  auVar271._24_4_ = fStack_288 * auVar77._24_4_ * 3.0;
  auVar271._28_4_ = 0;
  local_2a0 = fStack_288 * auVar15._0_4_ * 3.0;
  fStack_29c = fStack_288 * auVar15._4_4_ * 3.0;
  auVar27._4_4_ = fStack_29c;
  auVar27._0_4_ = local_2a0;
  fStack_298 = fStack_288 * auVar15._8_4_ * 3.0;
  auVar27._8_4_ = fStack_298;
  fStack_294 = fStack_288 * auVar15._12_4_ * 3.0;
  auVar27._12_4_ = fStack_294;
  fStack_290 = fStack_288 * auVar15._16_4_ * 3.0;
  auVar27._16_4_ = fStack_290;
  fStack_28c = fStack_288 * auVar15._20_4_ * 3.0;
  auVar27._20_4_ = fStack_28c;
  fStack_288 = fStack_288 * auVar15._24_4_ * 3.0;
  auVar27._24_4_ = fStack_288;
  auVar27._28_4_ = 0x40400000;
  auVar18 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar87));
  local_4e0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar242));
  auVar77 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar140));
  auVar15 = vsubps_avx(ZEXT1632(auVar242),ZEXT1632(auVar88));
  auVar78 = vsubps_avx(auVar18,auVar16);
  fVar262 = auVar77._0_4_ + auVar78._0_4_;
  fVar263 = auVar77._4_4_ + auVar78._4_4_;
  fVar188 = auVar77._8_4_ + auVar78._8_4_;
  fVar189 = auVar77._12_4_ + auVar78._12_4_;
  fVar190 = auVar77._16_4_ + auVar78._16_4_;
  fVar191 = auVar77._20_4_ + auVar78._20_4_;
  fVar192 = auVar77._24_4_ + auVar78._24_4_;
  auVar14 = vsubps_avx(local_4e0,auVar17);
  auVar79._0_4_ = auVar15._0_4_ + auVar14._0_4_;
  auVar79._4_4_ = auVar15._4_4_ + auVar14._4_4_;
  auVar79._8_4_ = auVar15._8_4_ + auVar14._8_4_;
  auVar79._12_4_ = auVar15._12_4_ + auVar14._12_4_;
  auVar79._16_4_ = auVar15._16_4_ + auVar14._16_4_;
  auVar79._20_4_ = auVar15._20_4_ + auVar14._20_4_;
  auVar79._24_4_ = auVar15._24_4_ + auVar14._24_4_;
  auVar79._28_4_ = auVar15._28_4_ + auVar14._28_4_;
  local_240 = ZEXT1632(auVar88);
  fVar82 = auVar88._0_4_;
  local_2c0 = (float)local_5c0._0_4_ + fVar82;
  fVar84 = auVar88._4_4_;
  fStack_2bc = (float)local_5c0._4_4_ + fVar84;
  fVar115 = auVar88._8_4_;
  fStack_2b8 = fStack_5b8 + fVar115;
  fVar83 = auVar88._12_4_;
  fStack_2b4 = fStack_5b4 + fVar83;
  fStack_2b0 = fStack_5b0 + 0.0;
  fStack_2ac = fStack_5ac + 0.0;
  fStack_2a8 = fStack_5a8 + 0.0;
  local_200 = ZEXT1632(auVar140);
  auVar15 = vsubps_avx(local_200,auVar249);
  local_220 = vpermps_avx2(_DAT_01fb7720,auVar15);
  auVar15 = vsubps_avx(local_240,_local_5c0);
  local_2e0 = vpermps_avx2(_DAT_01fb7720,auVar15);
  local_260._0_4_ = auVar87._0_4_ + auVar271._0_4_;
  local_260._4_4_ = auVar87._4_4_ + auVar271._4_4_;
  local_260._8_4_ = auVar87._8_4_ + auVar271._8_4_;
  local_260._12_4_ = auVar87._12_4_ + auVar271._12_4_;
  local_260._16_4_ = auVar271._16_4_ + 0.0;
  local_260._20_4_ = auVar271._20_4_ + 0.0;
  local_260._24_4_ = auVar271._24_4_ + 0.0;
  local_260._28_4_ = 0;
  auVar250 = ZEXT1632(auVar87);
  auVar15 = vsubps_avx(auVar250,auVar271);
  _local_5c0 = vpermps_avx2(_DAT_01fb7720,auVar15);
  fVar85 = auVar242._0_4_;
  local_2a0 = fVar85 + local_2a0;
  fVar155 = auVar242._4_4_;
  fStack_29c = fVar155 + fStack_29c;
  fVar220 = auVar242._8_4_;
  fStack_298 = fVar220 + fStack_298;
  fVar128 = auVar242._12_4_;
  fStack_294 = fVar128 + fStack_294;
  fStack_290 = fStack_290 + 0.0;
  fStack_28c = fStack_28c + 0.0;
  fStack_288 = fStack_288 + 0.0;
  auVar15 = vsubps_avx(ZEXT1632(auVar242),auVar27);
  local_280 = vpermps_avx2(_DAT_01fb7720,auVar15);
  auVar28._4_4_ = fVar84 * fVar263;
  auVar28._0_4_ = fVar82 * fVar262;
  auVar28._8_4_ = fVar115 * fVar188;
  auVar28._12_4_ = fVar83 * fVar189;
  auVar28._16_4_ = fVar190 * 0.0;
  auVar28._20_4_ = fVar191 * 0.0;
  auVar28._24_4_ = fVar192 * 0.0;
  auVar28._28_4_ = auVar15._28_4_;
  auVar8 = vfnmadd231ps_fma(auVar28,local_200,auVar79);
  fStack_2a4 = fVar59 + 0.0;
  auVar29._4_4_ = fStack_2bc * fVar263;
  auVar29._0_4_ = local_2c0 * fVar262;
  auVar29._8_4_ = fStack_2b8 * fVar188;
  auVar29._12_4_ = fStack_2b4 * fVar189;
  auVar29._16_4_ = fStack_2b0 * fVar190;
  auVar29._20_4_ = fStack_2ac * fVar191;
  auVar29._24_4_ = fStack_2a8 * fVar192;
  auVar29._28_4_ = 0;
  auVar9 = vfnmadd231ps_fma(auVar29,auVar79,auVar104);
  auVar30._4_4_ = local_2e0._4_4_ * fVar263;
  auVar30._0_4_ = local_2e0._0_4_ * fVar262;
  auVar30._8_4_ = local_2e0._8_4_ * fVar188;
  auVar30._12_4_ = local_2e0._12_4_ * fVar189;
  auVar30._16_4_ = local_2e0._16_4_ * fVar190;
  auVar30._20_4_ = local_2e0._20_4_ * fVar191;
  auVar30._24_4_ = local_2e0._24_4_ * fVar192;
  auVar30._28_4_ = fVar59 + 0.0;
  auVar121 = vfnmadd231ps_fma(auVar30,local_220,auVar79);
  local_7a0._0_4_ = auVar17._0_4_;
  local_7a0._4_4_ = auVar17._4_4_;
  uStack_798._0_4_ = auVar17._8_4_;
  uStack_798._4_4_ = auVar17._12_4_;
  uStack_790._0_4_ = auVar17._16_4_;
  uStack_790._4_4_ = auVar17._20_4_;
  uStack_788._0_4_ = auVar17._24_4_;
  uStack_788._4_4_ = auVar17._28_4_;
  auVar31._4_4_ = (float)local_7a0._4_4_ * fVar263;
  auVar31._0_4_ = (float)local_7a0._0_4_ * fVar262;
  auVar31._8_4_ = (float)uStack_798 * fVar188;
  auVar31._12_4_ = uStack_798._4_4_ * fVar189;
  auVar31._16_4_ = (float)uStack_790 * fVar190;
  auVar31._20_4_ = uStack_790._4_4_ * fVar191;
  auVar31._24_4_ = (float)uStack_788 * fVar192;
  auVar31._28_4_ = uStack_788._4_4_;
  auVar106 = vfnmadd231ps_fma(auVar31,auVar16,auVar79);
  auVar202._0_4_ = fVar85 * fVar262;
  auVar202._4_4_ = fVar155 * fVar263;
  auVar202._8_4_ = fVar220 * fVar188;
  auVar202._12_4_ = fVar128 * fVar189;
  auVar202._16_4_ = fVar190 * 0.0;
  auVar202._20_4_ = fVar191 * 0.0;
  auVar202._24_4_ = fVar192 * 0.0;
  auVar202._28_4_ = 0;
  auVar87 = vfnmadd231ps_fma(auVar202,auVar250,auVar79);
  uStack_284 = 0x40400000;
  auVar32._4_4_ = fStack_29c * fVar263;
  auVar32._0_4_ = local_2a0 * fVar262;
  auVar32._8_4_ = fStack_298 * fVar188;
  auVar32._12_4_ = fStack_294 * fVar189;
  auVar32._16_4_ = fStack_290 * fVar190;
  auVar32._20_4_ = fStack_28c * fVar191;
  auVar32._24_4_ = fStack_288 * fVar192;
  auVar32._28_4_ = auVar16._28_4_;
  auVar88 = vfnmadd231ps_fma(auVar32,local_260,auVar79);
  auVar33._4_4_ = local_280._4_4_ * fVar263;
  auVar33._0_4_ = local_280._0_4_ * fVar262;
  auVar33._8_4_ = local_280._8_4_ * fVar188;
  auVar33._12_4_ = local_280._12_4_ * fVar189;
  auVar33._16_4_ = local_280._16_4_ * fVar190;
  auVar33._20_4_ = local_280._20_4_ * fVar191;
  auVar33._24_4_ = local_280._24_4_ * fVar192;
  auVar33._28_4_ = local_280._28_4_;
  auVar60 = vfnmadd231ps_fma(auVar33,_local_5c0,auVar79);
  auVar34._4_4_ = local_4e0._4_4_ * fVar263;
  auVar34._0_4_ = local_4e0._0_4_ * fVar262;
  auVar34._8_4_ = local_4e0._8_4_ * fVar188;
  auVar34._12_4_ = local_4e0._12_4_ * fVar189;
  auVar34._16_4_ = local_4e0._16_4_ * fVar190;
  auVar34._20_4_ = local_4e0._20_4_ * fVar191;
  auVar34._24_4_ = local_4e0._24_4_ * fVar192;
  auVar34._28_4_ = auVar77._28_4_ + auVar78._28_4_;
  auVar218 = ZEXT3264(auVar18);
  auVar235 = vfnmadd231ps_fma(auVar34,auVar18,auVar79);
  auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar77 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar78 = vminps_avx(ZEXT1632(auVar121),ZEXT1632(auVar106));
  auVar78 = vminps_avx(auVar15,auVar78);
  auVar15 = vmaxps_avx(ZEXT1632(auVar121),ZEXT1632(auVar106));
  auVar77 = vmaxps_avx(auVar77,auVar15);
  auVar14 = vminps_avx(ZEXT1632(auVar87),ZEXT1632(auVar88));
  auVar15 = vmaxps_avx(ZEXT1632(auVar87),ZEXT1632(auVar88));
  auVar10 = vminps_avx(ZEXT1632(auVar60),ZEXT1632(auVar235));
  auVar14 = vminps_avx(auVar14,auVar10);
  auVar14 = vminps_avx(auVar78,auVar14);
  auVar78 = vmaxps_avx(ZEXT1632(auVar60),ZEXT1632(auVar235));
  auVar15 = vmaxps_avx(auVar15,auVar78);
  auVar15 = vmaxps_avx(auVar77,auVar15);
  auVar45._4_4_ = fStack_1bc;
  auVar45._0_4_ = local_1c0;
  auVar45._8_4_ = fStack_1b8;
  auVar45._12_4_ = fStack_1b4;
  auVar45._16_4_ = fStack_1b0;
  auVar45._20_4_ = fStack_1ac;
  auVar45._24_4_ = fStack_1a8;
  auVar45._28_4_ = fStack_1a4;
  auVar77 = vcmpps_avx(auVar14,auVar45,2);
  auVar44._4_4_ = fStack_1dc;
  auVar44._0_4_ = local_1e0;
  auVar44._8_4_ = fStack_1d8;
  auVar44._12_4_ = fStack_1d4;
  auVar44._16_4_ = fStack_1d0;
  auVar44._20_4_ = fStack_1cc;
  auVar44._24_4_ = fStack_1c8;
  auVar44._28_4_ = fStack_1c4;
  auVar15 = vcmpps_avx(auVar15,auVar44,5);
  auVar77 = vandps_avx(auVar15,auVar77);
  auVar15 = local_300 & auVar77;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    auVar15 = vsubps_avx(auVar16,local_200);
    auVar78 = vsubps_avx(auVar18,auVar250);
    fVar262 = auVar15._0_4_ + auVar78._0_4_;
    fVar263 = auVar15._4_4_ + auVar78._4_4_;
    fVar188 = auVar15._8_4_ + auVar78._8_4_;
    fVar189 = auVar15._12_4_ + auVar78._12_4_;
    fVar190 = auVar15._16_4_ + auVar78._16_4_;
    fVar191 = auVar15._20_4_ + auVar78._20_4_;
    fVar192 = auVar15._24_4_ + auVar78._24_4_;
    auVar14 = vsubps_avx(auVar17,local_240);
    auVar10 = vsubps_avx(local_4e0,ZEXT1632(auVar242));
    auVar105._0_4_ = auVar14._0_4_ + auVar10._0_4_;
    auVar105._4_4_ = auVar14._4_4_ + auVar10._4_4_;
    auVar105._8_4_ = auVar14._8_4_ + auVar10._8_4_;
    auVar105._12_4_ = auVar14._12_4_ + auVar10._12_4_;
    auVar105._16_4_ = auVar14._16_4_ + auVar10._16_4_;
    auVar105._20_4_ = auVar14._20_4_ + auVar10._20_4_;
    auVar105._24_4_ = auVar14._24_4_ + auVar10._24_4_;
    fVar59 = auVar10._28_4_;
    auVar105._28_4_ = auVar14._28_4_ + fVar59;
    auVar35._4_4_ = fVar84 * fVar263;
    auVar35._0_4_ = fVar82 * fVar262;
    auVar35._8_4_ = fVar115 * fVar188;
    auVar35._12_4_ = fVar83 * fVar189;
    auVar35._16_4_ = fVar190 * 0.0;
    auVar35._20_4_ = fVar191 * 0.0;
    auVar35._24_4_ = fVar192 * 0.0;
    auVar35._28_4_ = local_4e0._28_4_;
    auVar87 = vfnmadd231ps_fma(auVar35,auVar105,local_200);
    auVar36._4_4_ = fVar263 * fStack_2bc;
    auVar36._0_4_ = fVar262 * local_2c0;
    auVar36._8_4_ = fVar188 * fStack_2b8;
    auVar36._12_4_ = fVar189 * fStack_2b4;
    auVar36._16_4_ = fVar190 * fStack_2b0;
    auVar36._20_4_ = fVar191 * fStack_2ac;
    auVar36._24_4_ = fVar192 * fStack_2a8;
    auVar36._28_4_ = 0;
    auVar8 = vfnmadd213ps_fma(auVar104,auVar105,auVar36);
    auVar37._4_4_ = fVar263 * local_2e0._4_4_;
    auVar37._0_4_ = fVar262 * local_2e0._0_4_;
    auVar37._8_4_ = fVar188 * local_2e0._8_4_;
    auVar37._12_4_ = fVar189 * local_2e0._12_4_;
    auVar37._16_4_ = fVar190 * local_2e0._16_4_;
    auVar37._20_4_ = fVar191 * local_2e0._20_4_;
    auVar37._24_4_ = fVar192 * local_2e0._24_4_;
    auVar37._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(local_220,auVar105,auVar37);
    auVar38._4_4_ = (float)local_7a0._4_4_ * fVar263;
    auVar38._0_4_ = (float)local_7a0._0_4_ * fVar262;
    auVar38._8_4_ = (float)uStack_798 * fVar188;
    auVar38._12_4_ = uStack_798._4_4_ * fVar189;
    auVar38._16_4_ = (float)uStack_790 * fVar190;
    auVar38._20_4_ = uStack_790._4_4_ * fVar191;
    auVar38._24_4_ = (float)uStack_788 * fVar192;
    auVar38._28_4_ = 0;
    auVar242 = vfnmadd231ps_fma(auVar38,auVar105,auVar16);
    auVar126._0_4_ = fVar85 * fVar262;
    auVar126._4_4_ = fVar155 * fVar263;
    auVar126._8_4_ = fVar220 * fVar188;
    auVar126._12_4_ = fVar128 * fVar189;
    auVar126._16_4_ = fVar190 * 0.0;
    auVar126._20_4_ = fVar191 * 0.0;
    auVar126._24_4_ = fVar192 * 0.0;
    auVar126._28_4_ = 0;
    auVar88 = vfnmadd231ps_fma(auVar126,auVar105,auVar250);
    auVar39._4_4_ = fVar263 * fStack_29c;
    auVar39._0_4_ = fVar262 * local_2a0;
    auVar39._8_4_ = fVar188 * fStack_298;
    auVar39._12_4_ = fVar189 * fStack_294;
    auVar39._16_4_ = fVar190 * fStack_290;
    auVar39._20_4_ = fVar191 * fStack_28c;
    auVar39._24_4_ = fVar192 * fStack_288;
    auVar39._28_4_ = fVar59;
    auVar121 = vfnmadd213ps_fma(local_260,auVar105,auVar39);
    auVar40._4_4_ = fVar263 * local_280._4_4_;
    auVar40._0_4_ = fVar262 * local_280._0_4_;
    auVar40._8_4_ = fVar188 * local_280._8_4_;
    auVar40._12_4_ = fVar189 * local_280._12_4_;
    auVar40._16_4_ = fVar190 * local_280._16_4_;
    auVar40._20_4_ = fVar191 * local_280._20_4_;
    auVar40._24_4_ = fVar192 * local_280._24_4_;
    auVar40._28_4_ = fVar59;
    auVar106 = vfnmadd213ps_fma(_local_5c0,auVar105,auVar40);
    auVar218 = ZEXT1664(auVar106);
    auVar41._4_4_ = fVar263 * local_4e0._4_4_;
    auVar41._0_4_ = fVar262 * local_4e0._0_4_;
    auVar41._8_4_ = fVar188 * local_4e0._8_4_;
    auVar41._12_4_ = fVar189 * local_4e0._12_4_;
    auVar41._16_4_ = fVar190 * local_4e0._16_4_;
    auVar41._20_4_ = fVar191 * local_4e0._20_4_;
    auVar41._24_4_ = fVar192 * local_4e0._24_4_;
    auVar41._28_4_ = auVar15._28_4_ + auVar78._28_4_;
    auVar60 = vfnmadd231ps_fma(auVar41,auVar105,auVar18);
    auVar78 = vminps_avx(ZEXT1632(auVar87),ZEXT1632(auVar8));
    auVar15 = vmaxps_avx(ZEXT1632(auVar87),ZEXT1632(auVar8));
    auVar14 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar242));
    auVar14 = vminps_avx(auVar78,auVar14);
    auVar78 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar242));
    auVar15 = vmaxps_avx(auVar15,auVar78);
    auVar10 = vminps_avx(ZEXT1632(auVar88),ZEXT1632(auVar121));
    auVar78 = vmaxps_avx(ZEXT1632(auVar88),ZEXT1632(auVar121));
    auVar16 = vminps_avx(ZEXT1632(auVar106),ZEXT1632(auVar60));
    auVar10 = vminps_avx(auVar10,auVar16);
    auVar10 = vminps_avx(auVar14,auVar10);
    auVar14 = vmaxps_avx(ZEXT1632(auVar106),ZEXT1632(auVar60));
    auVar78 = vmaxps_avx(auVar78,auVar14);
    auVar78 = vmaxps_avx(auVar15,auVar78);
    auVar15 = vcmpps_avx(auVar10,auVar45,2);
    auVar78 = vcmpps_avx(auVar78,auVar44,5);
    auVar15 = vandps_avx(auVar78,auVar15);
    auVar77 = vandps_avx(auVar77,local_300);
    auVar78 = auVar77 & auVar15;
    if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar78 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar78 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar78 >> 0x7f,0) != '\0') ||
          (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar78 >> 0xbf,0) != '\0') ||
        (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar78[0x1f] < '\0')
    {
      auVar77 = vandps_avx(auVar15,auVar77);
      uVar53 = vmovmskps_avx(auVar77);
      if (uVar53 != 0) {
        auStack_4f0[uVar56] = uVar53 & 0xff;
        uVar86 = vmovlps_avx(local_440);
        *(undefined8 *)(&uStack_380 + uVar56 * 2) = uVar86;
        uVar55 = vmovlps_avx(auVar64);
        auStack_1a0[uVar56] = uVar55;
        uVar56 = (ulong)((int)uVar56 + 1);
      }
    }
  }
LAB_0110cc50:
  if ((int)uVar56 == 0) {
    uVar57 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar76._4_4_ = uVar57;
    auVar76._0_4_ = uVar57;
    auVar76._8_4_ = uVar57;
    auVar76._12_4_ = uVar57;
    auVar8 = vcmpps_avx(local_490,auVar76,2);
    uVar48 = vmovmskps_avx(auVar8);
    uVar54 = (ulong)((uint)uVar54 & uVar48);
    goto LAB_0110bec6;
  }
  uVar47 = (int)uVar56 - 1;
  uVar49 = (ulong)uVar47;
  uVar52 = auStack_4f0[uVar49];
  uVar53 = (&uStack_380)[uVar49 * 2];
  fVar82 = afStack_37c[uVar49 * 2];
  iVar46 = 0;
  for (uVar55 = (ulong)uVar52; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    iVar46 = iVar46 + 1;
  }
  uVar52 = uVar52 - 1 & uVar52;
  if (uVar52 == 0) {
    uVar56 = (ulong)uVar47;
  }
  auVar64._8_8_ = 0;
  auVar64._0_8_ = auStack_1a0[uVar49];
  auStack_4f0[uVar49] = uVar52;
  fVar84 = (float)(iVar46 + 1) * 0.14285715;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar82 * (float)iVar46 * 0.14285715)),ZEXT416(uVar53),
                           ZEXT416((uint)(1.0 - (float)iVar46 * 0.14285715)));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar82 * fVar84)),ZEXT416(uVar53),
                           ZEXT416((uint)(1.0 - fVar84)));
  fVar84 = auVar9._0_4_;
  auVar187._0_4_ = auVar8._0_4_;
  fVar82 = fVar84 - auVar187._0_4_;
  if (fVar82 < 0.16666667) {
    auVar121 = vshufps_avx(auVar64,auVar64,0x50);
    auVar93._8_4_ = 0x3f800000;
    auVar93._0_8_ = 0x3f8000003f800000;
    auVar93._12_4_ = 0x3f800000;
    auVar106 = vsubps_avx(auVar93,auVar121);
    fVar115 = auVar121._0_4_;
    auVar134._0_4_ = fVar115 * fVar129;
    fVar83 = auVar121._4_4_;
    auVar134._4_4_ = fVar83 * fVar139;
    fVar85 = auVar121._8_4_;
    auVar134._8_4_ = fVar85 * fVar129;
    fVar59 = auVar121._12_4_;
    auVar134._12_4_ = fVar59 * fVar139;
    auVar145._0_4_ = fVar115 * fVar251;
    auVar145._4_4_ = fVar83 * fVar261;
    auVar145._8_4_ = fVar85 * fVar251;
    auVar145._12_4_ = fVar59 * fVar261;
    auVar169._0_4_ = fVar115 * fVar193;
    auVar169._4_4_ = fVar83 * fVar203;
    auVar169._8_4_ = fVar85 * fVar193;
    auVar169._12_4_ = fVar59 * fVar203;
    auVar66._0_4_ = fVar115 * fVar204;
    auVar66._4_4_ = fVar83 * fVar219;
    auVar66._8_4_ = fVar85 * fVar204;
    auVar66._12_4_ = fVar59 * fVar219;
    auVar121 = vfmadd231ps_fma(auVar134,auVar106,auVar181);
    auVar87 = vfmadd231ps_fma(auVar145,auVar106,auVar225);
    auVar242 = vfmadd231ps_fma(auVar169,auVar106,auVar241);
    auVar106 = vfmadd231ps_fma(auVar66,auVar106,auVar254);
    auVar127._16_16_ = auVar121;
    auVar127._0_16_ = auVar121;
    auVar138._16_16_ = auVar87;
    auVar138._0_16_ = auVar87;
    auVar153._16_16_ = auVar242;
    auVar153._0_16_ = auVar242;
    auVar187._4_4_ = auVar187._0_4_;
    auVar187._8_4_ = auVar187._0_4_;
    auVar187._12_4_ = auVar187._0_4_;
    auVar187._20_4_ = fVar84;
    auVar187._16_4_ = fVar84;
    auVar187._24_4_ = fVar84;
    auVar187._28_4_ = fVar84;
    auVar77 = vsubps_avx(auVar138,auVar127);
    auVar87 = vfmadd213ps_fma(auVar77,auVar187,auVar127);
    auVar77 = vsubps_avx(auVar153,auVar138);
    auVar88 = vfmadd213ps_fma(auVar77,auVar187,auVar138);
    auVar121 = vsubps_avx(auVar106,auVar242);
    auVar80._16_16_ = auVar121;
    auVar80._0_16_ = auVar121;
    auVar121 = vfmadd213ps_fma(auVar80,auVar187,auVar153);
    auVar77 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar87));
    auVar106 = vfmadd213ps_fma(auVar77,auVar187,ZEXT1632(auVar87));
    auVar77 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar88));
    auVar121 = vfmadd213ps_fma(auVar77,auVar187,ZEXT1632(auVar88));
    auVar77 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar106));
    auVar130 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar77,auVar187);
    fVar220 = auVar77._4_4_ * 3.0;
    fVar115 = fVar82 * 0.33333334;
    local_4e0._0_8_ =
         CONCAT44(auVar130._4_4_ + fVar115 * fVar220,auVar130._0_4_ + fVar115 * auVar77._0_4_ * 3.0)
    ;
    local_4e0._8_4_ = auVar130._8_4_ + fVar115 * auVar77._8_4_ * 3.0;
    local_4e0._12_4_ = auVar130._12_4_ + fVar115 * auVar77._12_4_ * 3.0;
    auVar106 = vshufpd_avx(auVar130,auVar130,3);
    auVar87 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    auVar121 = vsubps_avx(auVar106,auVar130);
    auVar242 = vsubps_avx(auVar87,(undefined1  [16])0x0);
    auVar67._0_4_ = auVar121._0_4_ + auVar242._0_4_;
    auVar67._4_4_ = auVar121._4_4_ + auVar242._4_4_;
    auVar67._8_4_ = auVar121._8_4_ + auVar242._8_4_;
    auVar67._12_4_ = auVar121._12_4_ + auVar242._12_4_;
    auVar121 = vshufps_avx(auVar130,auVar130,0xb1);
    auVar242 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
    auVar267._4_4_ = auVar67._0_4_;
    auVar267._0_4_ = auVar67._0_4_;
    auVar267._8_4_ = auVar67._0_4_;
    auVar267._12_4_ = auVar67._0_4_;
    auVar88 = vshufps_avx(auVar67,auVar67,0x55);
    fVar83 = auVar88._0_4_;
    auVar68._0_4_ = fVar83 * auVar121._0_4_;
    fVar85 = auVar88._4_4_;
    auVar68._4_4_ = fVar85 * auVar121._4_4_;
    fVar59 = auVar88._8_4_;
    auVar68._8_4_ = fVar59 * auVar121._8_4_;
    fVar155 = auVar88._12_4_;
    auVar68._12_4_ = fVar155 * auVar121._12_4_;
    auVar146._0_4_ = fVar83 * auVar242._0_4_;
    auVar146._4_4_ = fVar85 * auVar242._4_4_;
    auVar146._8_4_ = fVar59 * auVar242._8_4_;
    auVar146._12_4_ = fVar155 * auVar242._12_4_;
    auVar60 = vfmadd231ps_fma(auVar68,auVar267,auVar130);
    auVar235 = vfmadd231ps_fma(auVar146,auVar267,local_4e0._0_16_);
    auVar242 = vshufps_avx(auVar60,auVar60,0xe8);
    auVar88 = vshufps_avx(auVar235,auVar235,0xe8);
    auVar121 = vcmpps_avx(auVar242,auVar88,1);
    uVar53 = vextractps_avx(auVar121,0);
    auVar140 = auVar235;
    if ((uVar53 & 1) == 0) {
      auVar140 = auVar60;
    }
    auVar117._0_4_ = fVar115 * auVar77._16_4_ * 3.0;
    auVar117._4_4_ = fVar115 * fVar220;
    auVar117._8_4_ = fVar115 * auVar77._24_4_ * 3.0;
    auVar117._12_4_ = fVar115 * auVar218._28_4_;
    auVar177 = vsubps_avx((undefined1  [16])0x0,auVar117);
    auVar118 = vshufps_avx(auVar177,auVar177,0xb1);
    auVar141 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar182._0_4_ = fVar83 * auVar118._0_4_;
    auVar182._4_4_ = fVar85 * auVar118._4_4_;
    auVar182._8_4_ = fVar59 * auVar118._8_4_;
    auVar182._12_4_ = fVar155 * auVar118._12_4_;
    auVar196._0_4_ = auVar141._0_4_ * fVar83;
    auVar196._4_4_ = auVar141._4_4_ * fVar85;
    auVar196._8_4_ = auVar141._8_4_ * fVar59;
    auVar196._12_4_ = auVar141._12_4_ * fVar155;
    _local_5c0 = auVar177;
    auVar178 = vfmadd231ps_fma(auVar182,auVar267,auVar177);
    auVar205 = vfmadd231ps_fma(auVar196,(undefined1  [16])0x0,auVar267);
    auVar141 = vshufps_avx(auVar178,auVar178,0xe8);
    auVar156 = vshufps_avx(auVar205,auVar205,0xe8);
    auVar218 = ZEXT1664(auVar156);
    auVar118 = vcmpps_avx(auVar141,auVar156,1);
    uVar53 = vextractps_avx(auVar118,0);
    auVar206 = auVar205;
    if ((uVar53 & 1) == 0) {
      auVar206 = auVar178;
    }
    auVar140 = vmaxss_avx(auVar206,auVar140);
    auVar242 = vminps_avx(auVar242,auVar88);
    auVar88 = vminps_avx(auVar141,auVar156);
    auVar88 = vminps_avx(auVar242,auVar88);
    auVar121 = vshufps_avx(auVar121,auVar121,0x55);
    auVar121 = vblendps_avx(auVar121,auVar118,2);
    auVar118 = vpslld_avx(auVar121,0x1f);
    auVar121 = vshufpd_avx(auVar235,auVar235,1);
    auVar121 = vinsertps_avx(auVar121,auVar205,0x9c);
    auVar242 = vshufpd_avx(auVar60,auVar60,1);
    auVar242 = vinsertps_avx(auVar242,auVar178,0x9c);
    auVar121 = vblendvps_avx(auVar242,auVar121,auVar118);
    auVar242 = vmovshdup_avx(auVar121);
    auVar121 = vmaxss_avx(auVar242,auVar121);
    fVar59 = auVar88._0_4_;
    auVar242 = vmovshdup_avx(auVar88);
    fVar85 = auVar121._0_4_;
    fVar115 = auVar242._0_4_;
    fVar83 = auVar140._0_4_;
    if (((0.0001 <= fVar59) || (fVar85 <= -0.0001)) && (0.0001 <= fVar115 || fVar85 <= -0.0001))
    goto code_r0x0110cf5e;
    goto LAB_0110cf84;
  }
  local_440 = vinsertps_avx(auVar8,auVar9,0x10);
  goto LAB_0110c69e;
code_r0x0110cf5e:
  auVar242 = vcmpps_avx(auVar242,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar60 = vcmpps_avx(auVar88,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar242 = vandps_avx(auVar60,auVar242);
  if (fVar83 <= -0.0001 || (auVar242 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0110cc50;
LAB_0110cf84:
  auVar60 = vcmpps_avx(auVar88,_DAT_01f45a50,1);
  auVar235 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar242 = vcmpss_avx(auVar140,ZEXT816(0) << 0x20,1);
  auVar94._8_4_ = 0x3f800000;
  auVar94._0_8_ = 0x3f8000003f800000;
  auVar94._12_4_ = 0x3f800000;
  auVar109._8_4_ = 0xbf800000;
  auVar109._0_8_ = 0xbf800000bf800000;
  auVar109._12_4_ = 0xbf800000;
  auVar242 = vblendvps_avx(auVar94,auVar109,auVar242);
  auVar60 = vblendvps_avx(auVar94,auVar109,auVar60);
  fVar220 = auVar60._0_4_;
  fVar155 = auVar242._0_4_;
  auVar242 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar220 == fVar155) && (!NAN(fVar220) && !NAN(fVar155))) {
    auVar242 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar220 == fVar155) && (!NAN(fVar220) && !NAN(fVar155))) {
    auVar235 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar60 = vmovshdup_avx(auVar60);
  fVar128 = auVar60._0_4_;
  if ((fVar220 != fVar128) || (NAN(fVar220) || NAN(fVar128))) {
    if ((fVar115 != fVar59) || (NAN(fVar115) || NAN(fVar59))) {
      auVar119._0_4_ = (float)((uint)fVar59 ^ local_510);
      auVar119._4_4_ = auVar88._4_4_ ^ uStack_50c;
      auVar119._8_4_ = auVar88._8_4_ ^ uStack_508;
      auVar119._12_4_ = auVar88._12_4_ ^ uStack_504;
      auVar120._0_4_ = auVar119._0_4_ / (fVar115 - fVar59);
      auVar120._4_12_ = auVar119._4_12_;
      auVar88 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar120._0_4_)),auVar120,ZEXT416(0));
      auVar60 = auVar88;
    }
    else {
      auVar88 = ZEXT816(0) << 0x20;
      if ((fVar59 != 0.0) || (auVar60 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar59))) {
        auVar88 = SUB6416(ZEXT464(0x7f800000),0);
        auVar60 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar242 = vminss_avx(auVar242,auVar88);
    auVar235 = vmaxss_avx(auVar60,auVar235);
  }
  auVar121 = vcmpss_avx(auVar121,ZEXT416(0),1);
  auVar95._8_4_ = 0x3f800000;
  auVar95._0_8_ = 0x3f8000003f800000;
  auVar95._12_4_ = 0x3f800000;
  auVar110._8_4_ = 0xbf800000;
  auVar110._0_8_ = 0xbf800000bf800000;
  auVar110._12_4_ = 0xbf800000;
  auVar121 = vblendvps_avx(auVar95,auVar110,auVar121);
  fVar115 = auVar121._0_4_;
  if ((fVar155 != fVar115) || (NAN(fVar155) || NAN(fVar115))) {
    if ((fVar85 != fVar83) || (NAN(fVar85) || NAN(fVar83))) {
      auVar69._0_4_ = (float)((uint)fVar83 ^ local_510);
      auVar69._4_4_ = auVar140._4_4_ ^ uStack_50c;
      auVar69._8_4_ = auVar140._8_4_ ^ uStack_508;
      auVar69._12_4_ = auVar140._12_4_ ^ uStack_504;
      auVar122._0_4_ = auVar69._0_4_ / (fVar85 - fVar83);
      auVar122._4_12_ = auVar69._4_12_;
      auVar121 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar122._0_4_)),auVar122,ZEXT416(0));
      auVar88 = auVar121;
    }
    else {
      auVar121 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar83 != 0.0) || (auVar88 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar83))) {
        auVar121 = SUB6416(ZEXT464(0xff800000),0);
        auVar88 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar242 = vminss_avx(auVar242,auVar88);
    auVar235 = vmaxss_avx(auVar121,auVar235);
  }
  if ((fVar128 != fVar115) || (NAN(fVar128) || NAN(fVar115))) {
    auVar242 = vminss_avx(auVar242,SUB6416(ZEXT464(0x3f800000),0));
    auVar235 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar235);
  }
  auVar121 = vmaxss_avx(ZEXT816(0) << 0x40,auVar242);
  auVar242 = vminss_avx(auVar235,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar242._0_4_ < auVar121._0_4_) goto LAB_0110cc50;
  auVar121 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar121._0_4_ + -0.1)));
  auVar242 = vminss_avx(ZEXT416((uint)(auVar242._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar135._0_8_ = auVar130._0_8_;
  auVar135._8_8_ = auVar135._0_8_;
  auVar210._8_8_ = local_4e0._0_8_;
  auVar210._0_8_ = local_4e0._0_8_;
  auVar226._8_8_ = auVar177._0_8_;
  auVar226._0_8_ = auVar177._0_8_;
  auVar88 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
  auVar60 = vshufpd_avx(auVar177,auVar177,3);
  auVar235 = vshufps_avx(auVar121,auVar242,0);
  auVar70._8_4_ = 0x3f800000;
  auVar70._0_8_ = 0x3f8000003f800000;
  auVar70._12_4_ = 0x3f800000;
  auVar130 = vsubps_avx(auVar70,auVar235);
  local_640 = auVar106._0_4_;
  fStack_63c = auVar106._4_4_;
  fStack_638 = auVar106._8_4_;
  fStack_634 = auVar106._12_4_;
  fVar115 = auVar235._0_4_;
  auVar71._0_4_ = fVar115 * local_640;
  fVar83 = auVar235._4_4_;
  auVar71._4_4_ = fVar83 * fStack_63c;
  fVar85 = auVar235._8_4_;
  auVar71._8_4_ = fVar85 * fStack_638;
  fVar59 = auVar235._12_4_;
  auVar71._12_4_ = fVar59 * fStack_634;
  auVar170._0_4_ = fVar115 * auVar88._0_4_;
  auVar170._4_4_ = fVar83 * auVar88._4_4_;
  auVar170._8_4_ = fVar85 * auVar88._8_4_;
  auVar170._12_4_ = fVar59 * auVar88._12_4_;
  auVar183._0_4_ = fVar115 * auVar60._0_4_;
  auVar183._4_4_ = fVar83 * auVar60._4_4_;
  auVar183._8_4_ = fVar85 * auVar60._8_4_;
  auVar183._12_4_ = fVar59 * auVar60._12_4_;
  auVar197._0_4_ = fVar115 * auVar87._0_4_;
  auVar197._4_4_ = fVar83 * auVar87._4_4_;
  auVar197._8_4_ = fVar85 * auVar87._8_4_;
  auVar197._12_4_ = fVar59 * auVar87._12_4_;
  auVar88 = vfmadd231ps_fma(auVar71,auVar130,auVar135);
  auVar60 = vfmadd231ps_fma(auVar170,auVar130,auVar210);
  auVar235 = vfmadd231ps_fma(auVar183,auVar130,auVar226);
  auVar130 = vfmadd231ps_fma(auVar197,auVar130,ZEXT816(0));
  auVar106 = vmovshdup_avx(auVar64);
  auVar177 = vfmadd231ss_fma(ZEXT416((uint)(auVar106._0_4_ * auVar121._0_4_)),auVar64,
                             ZEXT416((uint)(1.0 - auVar121._0_4_)));
  auVar178 = vfmadd231ss_fma(ZEXT416((uint)(auVar106._0_4_ * auVar242._0_4_)),auVar64,
                             ZEXT416((uint)(1.0 - auVar242._0_4_)));
  fVar115 = 1.0 / fVar82;
  auVar121 = vsubps_avx(auVar60,auVar88);
  auVar211._0_4_ = auVar121._0_4_ * 3.0;
  auVar211._4_4_ = auVar121._4_4_ * 3.0;
  auVar211._8_4_ = auVar121._8_4_ * 3.0;
  auVar211._12_4_ = auVar121._12_4_ * 3.0;
  auVar121 = vsubps_avx(auVar235,auVar60);
  auVar227._0_4_ = auVar121._0_4_ * 3.0;
  auVar227._4_4_ = auVar121._4_4_ * 3.0;
  auVar227._8_4_ = auVar121._8_4_ * 3.0;
  auVar227._12_4_ = auVar121._12_4_ * 3.0;
  auVar121 = vsubps_avx(auVar130,auVar235);
  auVar236._0_4_ = auVar121._0_4_ * 3.0;
  auVar236._4_4_ = auVar121._4_4_ * 3.0;
  auVar236._8_4_ = auVar121._8_4_ * 3.0;
  auVar236._12_4_ = auVar121._12_4_ * 3.0;
  auVar106 = vminps_avx(auVar227,auVar236);
  auVar121 = vmaxps_avx(auVar227,auVar236);
  auVar106 = vminps_avx(auVar211,auVar106);
  auVar121 = vmaxps_avx(auVar211,auVar121);
  auVar87 = vshufpd_avx(auVar106,auVar106,3);
  auVar242 = vshufpd_avx(auVar121,auVar121,3);
  auVar106 = vminps_avx(auVar106,auVar87);
  auVar121 = vmaxps_avx(auVar121,auVar242);
  auVar228._0_4_ = auVar106._0_4_ * fVar115;
  auVar228._4_4_ = auVar106._4_4_ * fVar115;
  auVar228._8_4_ = auVar106._8_4_ * fVar115;
  auVar228._12_4_ = auVar106._12_4_ * fVar115;
  auVar212._0_4_ = auVar121._0_4_ * fVar115;
  auVar212._4_4_ = auVar121._4_4_ * fVar115;
  auVar212._8_4_ = auVar121._8_4_ * fVar115;
  auVar212._12_4_ = auVar121._12_4_ * fVar115;
  fVar115 = 1.0 / (auVar178._0_4_ - auVar177._0_4_);
  auVar121 = vshufpd_avx(auVar88,auVar88,3);
  auVar106 = vshufpd_avx(auVar60,auVar60,3);
  auVar87 = vshufpd_avx(auVar235,auVar235,3);
  auVar242 = vshufpd_avx(auVar130,auVar130,3);
  auVar121 = vsubps_avx(auVar121,auVar88);
  auVar88 = vsubps_avx(auVar106,auVar60);
  auVar60 = vsubps_avx(auVar87,auVar235);
  auVar242 = vsubps_avx(auVar242,auVar130);
  auVar106 = vminps_avx(auVar121,auVar88);
  auVar121 = vmaxps_avx(auVar121,auVar88);
  auVar87 = vminps_avx(auVar60,auVar242);
  auVar87 = vminps_avx(auVar106,auVar87);
  auVar106 = vmaxps_avx(auVar60,auVar242);
  auVar121 = vmaxps_avx(auVar121,auVar106);
  auVar255._0_4_ = fVar115 * auVar87._0_4_;
  auVar255._4_4_ = fVar115 * auVar87._4_4_;
  auVar255._8_4_ = fVar115 * auVar87._8_4_;
  auVar255._12_4_ = fVar115 * auVar87._12_4_;
  auVar243._0_4_ = fVar115 * auVar121._0_4_;
  auVar243._4_4_ = fVar115 * auVar121._4_4_;
  auVar243._8_4_ = fVar115 * auVar121._8_4_;
  auVar243._12_4_ = fVar115 * auVar121._12_4_;
  auVar242 = vinsertps_avx(auVar8,auVar177,0x10);
  auVar88 = vinsertps_avx(auVar9,auVar178,0x10);
  auVar237._0_4_ = (auVar242._0_4_ + auVar88._0_4_) * 0.5;
  auVar237._4_4_ = (auVar242._4_4_ + auVar88._4_4_) * 0.5;
  auVar237._8_4_ = (auVar242._8_4_ + auVar88._8_4_) * 0.5;
  auVar237._12_4_ = (auVar242._12_4_ + auVar88._12_4_) * 0.5;
  auVar72._4_4_ = auVar237._0_4_;
  auVar72._0_4_ = auVar237._0_4_;
  auVar72._8_4_ = auVar237._0_4_;
  auVar72._12_4_ = auVar237._0_4_;
  auVar121 = vfmadd213ps_fma(local_390,auVar72,auVar11);
  auVar106 = vfmadd213ps_fma(local_3a0,auVar72,auVar12);
  auVar87 = vfmadd213ps_fma(local_3b0,auVar72,auVar13);
  auVar9 = vsubps_avx(auVar106,auVar121);
  auVar121 = vfmadd213ps_fma(auVar9,auVar72,auVar121);
  auVar9 = vsubps_avx(auVar87,auVar106);
  auVar9 = vfmadd213ps_fma(auVar9,auVar72,auVar106);
  auVar9 = vsubps_avx(auVar9,auVar121);
  auVar121 = vfmadd231ps_fma(auVar121,auVar9,auVar72);
  auVar73._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
  auVar73._8_4_ = auVar9._8_4_ * 3.0;
  auVar73._12_4_ = auVar9._12_4_ * 3.0;
  auVar268._8_8_ = auVar121._0_8_;
  auVar268._0_8_ = auVar121._0_8_;
  auVar9 = vshufpd_avx(auVar121,auVar121,3);
  auVar121 = vshufps_avx(auVar237,auVar237,0x55);
  auVar235 = vsubps_avx(auVar9,auVar268);
  auVar140 = vfmadd231ps_fma(auVar268,auVar121,auVar235);
  auVar274._8_8_ = auVar73._0_8_;
  auVar274._0_8_ = auVar73._0_8_;
  auVar9 = vshufpd_avx(auVar73,auVar73,3);
  auVar9 = vsubps_avx(auVar9,auVar274);
  auVar130 = vfmadd213ps_fma(auVar9,auVar121,auVar274);
  auVar121 = vmovshdup_avx(auVar130);
  auVar275._0_8_ = auVar121._0_8_ ^ 0x8000000080000000;
  auVar275._8_4_ = auVar121._8_4_ ^ 0x80000000;
  auVar275._12_4_ = auVar121._12_4_ ^ 0x80000000;
  auVar106 = vmovshdup_avx(auVar235);
  auVar9 = vunpcklps_avx(auVar106,auVar275);
  auVar87 = vshufps_avx(auVar9,auVar275,4);
  auVar60 = vshufps_avx(auVar237,auVar237,0x54);
  auVar123._0_8_ = auVar235._0_8_ ^ 0x8000000080000000;
  auVar123._8_4_ = auVar235._8_4_ ^ 0x80000000;
  auVar123._12_4_ = auVar235._12_4_ ^ 0x80000000;
  auVar9 = vmovlhps_avx(auVar123,auVar130);
  auVar9 = vshufps_avx(auVar9,auVar130,8);
  auVar121 = vfmsub231ss_fma(ZEXT416((uint)(auVar235._0_4_ * auVar121._0_4_)),auVar106,auVar130);
  uVar57 = auVar121._0_4_;
  auVar74._4_4_ = uVar57;
  auVar74._0_4_ = uVar57;
  auVar74._8_4_ = uVar57;
  auVar74._12_4_ = uVar57;
  auVar121 = vdivps_avx(auVar87,auVar74);
  auVar106 = vdivps_avx(auVar9,auVar74);
  fVar85 = auVar140._0_4_;
  fVar115 = auVar121._0_4_;
  auVar9 = vshufps_avx(auVar140,auVar140,0x55);
  fVar83 = auVar106._0_4_;
  auVar75._0_4_ = fVar85 * fVar115 + auVar9._0_4_ * fVar83;
  auVar75._4_4_ = fVar85 * auVar121._4_4_ + auVar9._4_4_ * auVar106._4_4_;
  auVar75._8_4_ = fVar85 * auVar121._8_4_ + auVar9._8_4_ * auVar106._8_4_;
  auVar75._12_4_ = fVar85 * auVar121._12_4_ + auVar9._12_4_ * auVar106._12_4_;
  auVar156 = vsubps_avx(auVar60,auVar75);
  auVar60 = vmovshdup_avx(auVar121);
  auVar9 = vinsertps_avx(auVar228,auVar255,0x1c);
  auVar147._0_4_ = auVar60._0_4_ * auVar9._0_4_;
  auVar147._4_4_ = auVar60._4_4_ * auVar9._4_4_;
  auVar147._8_4_ = auVar60._8_4_ * auVar9._8_4_;
  auVar147._12_4_ = auVar60._12_4_ * auVar9._12_4_;
  auVar87 = vinsertps_avx(auVar212,auVar243,0x1c);
  auVar96._0_4_ = auVar87._0_4_ * auVar60._0_4_;
  auVar96._4_4_ = auVar87._4_4_ * auVar60._4_4_;
  auVar96._8_4_ = auVar87._8_4_ * auVar60._8_4_;
  auVar96._12_4_ = auVar87._12_4_ * auVar60._12_4_;
  auVar140 = vminps_avx(auVar147,auVar96);
  auVar130 = vmaxps_avx(auVar96,auVar147);
  auVar60 = vinsertps_avx(auVar255,auVar228,0x4c);
  auVar118 = vmovshdup_avx(auVar106);
  auVar235 = vinsertps_avx(auVar243,auVar212,0x4c);
  auVar244._0_4_ = auVar118._0_4_ * auVar60._0_4_;
  auVar244._4_4_ = auVar118._4_4_ * auVar60._4_4_;
  auVar244._8_4_ = auVar118._8_4_ * auVar60._8_4_;
  auVar244._12_4_ = auVar118._12_4_ * auVar60._12_4_;
  auVar229._0_4_ = auVar118._0_4_ * auVar235._0_4_;
  auVar229._4_4_ = auVar118._4_4_ * auVar235._4_4_;
  auVar229._8_4_ = auVar118._8_4_ * auVar235._8_4_;
  auVar229._12_4_ = auVar118._12_4_ * auVar235._12_4_;
  auVar118 = vminps_avx(auVar244,auVar229);
  auVar256._0_4_ = auVar140._0_4_ + auVar118._0_4_;
  auVar256._4_4_ = auVar140._4_4_ + auVar118._4_4_;
  auVar256._8_4_ = auVar140._8_4_ + auVar118._8_4_;
  auVar256._12_4_ = auVar140._12_4_ + auVar118._12_4_;
  auVar140 = vmaxps_avx(auVar229,auVar244);
  auVar97._0_4_ = auVar140._0_4_ + auVar130._0_4_;
  auVar97._4_4_ = auVar140._4_4_ + auVar130._4_4_;
  auVar97._8_4_ = auVar140._8_4_ + auVar130._8_4_;
  auVar97._12_4_ = auVar140._12_4_ + auVar130._12_4_;
  auVar230._8_8_ = 0x3f80000000000000;
  auVar230._0_8_ = 0x3f80000000000000;
  auVar130 = vsubps_avx(auVar230,auVar97);
  auVar140 = vsubps_avx(auVar230,auVar256);
  auVar118 = vsubps_avx(auVar242,auVar237);
  auVar141 = vsubps_avx(auVar88,auVar237);
  auVar111._0_4_ = fVar115 * auVar9._0_4_;
  auVar111._4_4_ = fVar115 * auVar9._4_4_;
  auVar111._8_4_ = fVar115 * auVar9._8_4_;
  auVar111._12_4_ = fVar115 * auVar9._12_4_;
  auVar257._0_4_ = fVar115 * auVar87._0_4_;
  auVar257._4_4_ = fVar115 * auVar87._4_4_;
  auVar257._8_4_ = fVar115 * auVar87._8_4_;
  auVar257._12_4_ = fVar115 * auVar87._12_4_;
  auVar87 = vminps_avx(auVar111,auVar257);
  auVar9 = vmaxps_avx(auVar257,auVar111);
  auVar148._0_4_ = fVar83 * auVar60._0_4_;
  auVar148._4_4_ = fVar83 * auVar60._4_4_;
  auVar148._8_4_ = fVar83 * auVar60._8_4_;
  auVar148._12_4_ = fVar83 * auVar60._12_4_;
  auVar213._0_4_ = fVar83 * auVar235._0_4_;
  auVar213._4_4_ = fVar83 * auVar235._4_4_;
  auVar213._8_4_ = fVar83 * auVar235._8_4_;
  auVar213._12_4_ = fVar83 * auVar235._12_4_;
  auVar60 = vminps_avx(auVar148,auVar213);
  auVar258._0_4_ = auVar87._0_4_ + auVar60._0_4_;
  auVar258._4_4_ = auVar87._4_4_ + auVar60._4_4_;
  auVar258._8_4_ = auVar87._8_4_ + auVar60._8_4_;
  auVar258._12_4_ = auVar87._12_4_ + auVar60._12_4_;
  fVar128 = auVar118._0_4_;
  auVar269._0_4_ = fVar128 * auVar130._0_4_;
  fVar262 = auVar118._4_4_;
  auVar269._4_4_ = fVar262 * auVar130._4_4_;
  fVar263 = auVar118._8_4_;
  auVar269._8_4_ = fVar263 * auVar130._8_4_;
  fVar188 = auVar118._12_4_;
  auVar269._12_4_ = fVar188 * auVar130._12_4_;
  auVar87 = vmaxps_avx(auVar213,auVar148);
  auVar214._0_4_ = fVar128 * auVar140._0_4_;
  auVar214._4_4_ = fVar262 * auVar140._4_4_;
  auVar214._8_4_ = fVar263 * auVar140._8_4_;
  auVar214._12_4_ = fVar188 * auVar140._12_4_;
  fVar85 = auVar141._0_4_;
  auVar98._0_4_ = fVar85 * auVar130._0_4_;
  fVar59 = auVar141._4_4_;
  auVar98._4_4_ = fVar59 * auVar130._4_4_;
  fVar155 = auVar141._8_4_;
  auVar98._8_4_ = fVar155 * auVar130._8_4_;
  fVar220 = auVar141._12_4_;
  auVar98._12_4_ = fVar220 * auVar130._12_4_;
  auVar231._0_4_ = fVar85 * auVar140._0_4_;
  auVar231._4_4_ = fVar59 * auVar140._4_4_;
  auVar231._8_4_ = fVar155 * auVar140._8_4_;
  auVar231._12_4_ = fVar220 * auVar140._12_4_;
  auVar112._0_4_ = auVar9._0_4_ + auVar87._0_4_;
  auVar112._4_4_ = auVar9._4_4_ + auVar87._4_4_;
  auVar112._8_4_ = auVar9._8_4_ + auVar87._8_4_;
  auVar112._12_4_ = auVar9._12_4_ + auVar87._12_4_;
  auVar149._8_8_ = 0x3f800000;
  auVar149._0_8_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar149,auVar112);
  auVar87 = vsubps_avx(auVar149,auVar258);
  auVar259._0_4_ = fVar128 * auVar9._0_4_;
  auVar259._4_4_ = fVar262 * auVar9._4_4_;
  auVar259._8_4_ = fVar263 * auVar9._8_4_;
  auVar259._12_4_ = fVar188 * auVar9._12_4_;
  auVar245._0_4_ = fVar128 * auVar87._0_4_;
  auVar245._4_4_ = fVar262 * auVar87._4_4_;
  auVar245._8_4_ = fVar263 * auVar87._8_4_;
  auVar245._12_4_ = fVar188 * auVar87._12_4_;
  auVar113._0_4_ = fVar85 * auVar9._0_4_;
  auVar113._4_4_ = fVar59 * auVar9._4_4_;
  auVar113._8_4_ = fVar155 * auVar9._8_4_;
  auVar113._12_4_ = fVar220 * auVar9._12_4_;
  auVar150._0_4_ = fVar85 * auVar87._0_4_;
  auVar150._4_4_ = fVar59 * auVar87._4_4_;
  auVar150._8_4_ = fVar155 * auVar87._8_4_;
  auVar150._12_4_ = fVar220 * auVar87._12_4_;
  auVar9 = vminps_avx(auVar259,auVar245);
  auVar87 = vminps_avx(auVar113,auVar150);
  auVar9 = vminps_avx(auVar9,auVar87);
  auVar87 = vmaxps_avx(auVar245,auVar259);
  auVar60 = vmaxps_avx(auVar150,auVar113);
  auVar235 = vminps_avx(auVar269,auVar214);
  auVar130 = vminps_avx(auVar98,auVar231);
  auVar235 = vminps_avx(auVar235,auVar130);
  auVar9 = vhaddps_avx(auVar9,auVar235);
  auVar87 = vmaxps_avx(auVar60,auVar87);
  auVar60 = vmaxps_avx(auVar214,auVar269);
  auVar235 = vmaxps_avx(auVar231,auVar98);
  auVar60 = vmaxps_avx(auVar235,auVar60);
  auVar87 = vhaddps_avx(auVar87,auVar60);
  auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
  auVar87 = vshufps_avx(auVar87,auVar87,0xe8);
  auVar232._0_4_ = auVar156._0_4_ + auVar9._0_4_;
  auVar232._4_4_ = auVar156._4_4_ + auVar9._4_4_;
  auVar232._8_4_ = auVar156._8_4_ + auVar9._8_4_;
  auVar232._12_4_ = auVar156._12_4_ + auVar9._12_4_;
  auVar215._0_4_ = auVar156._0_4_ + auVar87._0_4_;
  auVar215._4_4_ = auVar156._4_4_ + auVar87._4_4_;
  auVar215._8_4_ = auVar156._8_4_ + auVar87._8_4_;
  auVar215._12_4_ = auVar156._12_4_ + auVar87._12_4_;
  auVar218 = ZEXT1664(auVar215);
  auVar9 = vmaxps_avx(auVar242,auVar232);
  auVar87 = vminps_avx(auVar215,auVar88);
  auVar9 = vcmpps_avx(auVar87,auVar9,1);
  auVar9 = vshufps_avx(auVar9,auVar9,0x50);
  if ((auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar9[0xf] < '\0')
  goto LAB_0110cc50;
  bVar51 = 0;
  if ((auVar187._0_4_ < auVar232._0_4_) && (bVar51 = 0, auVar215._0_4_ < auVar88._0_4_)) {
    auVar87 = vmovshdup_avx(auVar232);
    auVar9 = vcmpps_avx(auVar215,auVar88,1);
    bVar51 = auVar9[4] & auVar177._0_4_ < auVar87._0_4_;
  }
  if (((3 < (uint)uVar56 || fVar82 < 0.001) | bVar51) == 1) {
    lVar50 = 0xc9;
    auVar218 = ZEXT464(0x40400000);
    do {
      lVar50 = lVar50 + -1;
      if (lVar50 == 0) goto LAB_0110cc50;
      fVar59 = auVar156._0_4_;
      fVar85 = 1.0 - fVar59;
      fVar82 = fVar85 * fVar85 * fVar85;
      fVar84 = fVar59 * 3.0 * fVar85 * fVar85;
      fVar85 = fVar85 * fVar59 * fVar59 * 3.0;
      auVar136._4_4_ = fVar82;
      auVar136._0_4_ = fVar82;
      auVar136._8_4_ = fVar82;
      auVar136._12_4_ = fVar82;
      auVar114._4_4_ = fVar84;
      auVar114._0_4_ = fVar84;
      auVar114._8_4_ = fVar84;
      auVar114._12_4_ = fVar84;
      auVar99._4_4_ = fVar85;
      auVar99._0_4_ = fVar85;
      auVar99._8_4_ = fVar85;
      auVar99._12_4_ = fVar85;
      fVar59 = fVar59 * fVar59 * fVar59;
      auVar151._0_4_ = (float)local_3c0._0_4_ * fVar59;
      auVar151._4_4_ = (float)local_3c0._4_4_ * fVar59;
      auVar151._8_4_ = fStack_3b8 * fVar59;
      auVar151._12_4_ = fStack_3b4 * fVar59;
      auVar8 = vfmadd231ps_fma(auVar151,auVar13,auVar99);
      auVar8 = vfmadd231ps_fma(auVar8,auVar12,auVar114);
      auVar8 = vfmadd231ps_fma(auVar8,auVar11,auVar136);
      auVar100._8_8_ = auVar8._0_8_;
      auVar100._0_8_ = auVar8._0_8_;
      auVar8 = vshufpd_avx(auVar8,auVar8,3);
      auVar9 = vshufps_avx(auVar156,auVar156,0x55);
      auVar8 = vsubps_avx(auVar8,auVar100);
      auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar100);
      fVar82 = auVar9._0_4_;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar101._0_4_ = fVar115 * fVar82 + fVar83 * auVar8._0_4_;
      auVar101._4_4_ = auVar121._4_4_ * fVar82 + auVar106._4_4_ * auVar8._4_4_;
      auVar101._8_4_ = auVar121._8_4_ * fVar82 + auVar106._8_4_ * auVar8._8_4_;
      auVar101._12_4_ = auVar121._12_4_ * fVar82 + auVar106._12_4_ * auVar8._12_4_;
      auVar156 = vsubps_avx(auVar156,auVar101);
      auVar8 = vandps_avx(local_500,auVar9);
      auVar9 = vshufps_avx(auVar8,auVar8,0xf5);
      auVar8 = vmaxss_avx(auVar9,auVar8);
    } while ((float)local_3d0._0_4_ <= auVar8._0_4_);
    local_120 = auVar156._0_4_;
    if ((0.0 <= local_120) && (local_120 <= 1.0)) {
      auVar8 = vmovshdup_avx(auVar156);
      fVar82 = auVar8._0_4_;
      if ((0.0 <= fVar82) && (fVar82 <= 1.0)) {
        auVar9 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                               ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar235 = vinsertps_avx(auVar9,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar9 = vdpps_avx(auVar235,local_520,0x7f);
        auVar121 = vdpps_avx(auVar235,local_530,0x7f);
        auVar106 = vdpps_avx(auVar235,local_3e0,0x7f);
        auVar87 = vdpps_avx(auVar235,local_3f0,0x7f);
        auVar242 = vdpps_avx(auVar235,local_400,0x7f);
        auVar88 = vdpps_avx(auVar235,local_410,0x7f);
        auVar60 = vdpps_avx(auVar235,local_420,0x7f);
        auVar235 = vdpps_avx(auVar235,local_430,0x7f);
        fVar84 = 1.0 - fVar82;
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar82 * auVar242._0_4_)),ZEXT416((uint)fVar84),
                                 auVar9);
        auVar121 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ * fVar82)),ZEXT416((uint)fVar84),
                                   auVar121);
        auVar218 = ZEXT1664(auVar121);
        auVar106 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar82)),ZEXT416((uint)fVar84),
                                   auVar106);
        auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar82 * auVar235._0_4_)),ZEXT416((uint)fVar84),
                                  auVar87);
        fVar85 = 1.0 - local_120;
        fVar84 = fVar85 * local_120 * local_120 * 3.0;
        fVar155 = local_120 * local_120 * local_120;
        auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar155 * auVar87._0_4_)),ZEXT416((uint)fVar84),
                                   auVar106);
        fVar115 = local_120 * 3.0 * fVar85 * fVar85;
        auVar121 = vfmadd231ss_fma(auVar106,ZEXT416((uint)fVar115),auVar121);
        fVar83 = fVar85 * fVar85 * fVar85;
        auVar9 = vfmadd231ss_fma(auVar121,ZEXT416((uint)fVar83),auVar9);
        fVar59 = auVar9._0_4_;
        if (((fVar58 <= fVar59) && (fVar220 = *(float *)(ray + k * 4 + 0x100), fVar59 <= fVar220))
           && (pGVar4 = (context->scene->geometries).items[uVar48].ptr,
              (pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
          auVar9 = vshufps_avx(auVar156,auVar156,0x55);
          auVar216._8_4_ = 0x3f800000;
          auVar216._0_8_ = 0x3f8000003f800000;
          auVar216._12_4_ = 0x3f800000;
          auVar121 = vsubps_avx(auVar216,auVar9);
          fVar128 = auVar9._0_4_;
          auVar233._0_4_ = fVar128 * (float)local_550._0_4_;
          fVar262 = auVar9._4_4_;
          auVar233._4_4_ = fVar262 * (float)local_550._4_4_;
          fVar263 = auVar9._8_4_;
          auVar233._8_4_ = fVar263 * fStack_548;
          fVar188 = auVar9._12_4_;
          auVar233._12_4_ = fVar188 * fStack_544;
          auVar238._0_4_ = fVar128 * (float)local_590._0_4_;
          auVar238._4_4_ = fVar262 * (float)local_590._4_4_;
          auVar238._8_4_ = fVar263 * fStack_588;
          auVar238._12_4_ = fVar188 * fStack_584;
          auVar246._0_4_ = fVar128 * (float)local_5a0._0_4_;
          auVar246._4_4_ = fVar262 * (float)local_5a0._4_4_;
          auVar246._8_4_ = fVar263 * fStack_598;
          auVar246._12_4_ = fVar188 * fStack_594;
          auVar198._0_4_ = fVar128 * fVar154;
          auVar198._4_4_ = fVar262 * fVar174;
          auVar198._8_4_ = fVar263 * fVar175;
          auVar198._12_4_ = fVar188 * fVar176;
          auVar9 = vfmadd231ps_fma(auVar233,auVar121,local_540);
          auVar106 = vfmadd231ps_fma(auVar238,auVar121,local_570);
          auVar87 = vfmadd231ps_fma(auVar246,auVar121,local_580);
          auVar242 = vfmadd231ps_fma(auVar198,auVar121,local_560);
          auVar121 = vsubps_avx(auVar106,auVar9);
          auVar218 = ZEXT1664(auVar121);
          auVar9 = vsubps_avx(auVar87,auVar106);
          auVar106 = vsubps_avx(auVar242,auVar87);
          auVar247._0_4_ = local_120 * auVar9._0_4_;
          auVar247._4_4_ = local_120 * auVar9._4_4_;
          auVar247._8_4_ = local_120 * auVar9._8_4_;
          auVar247._12_4_ = local_120 * auVar9._12_4_;
          auVar184._4_4_ = fVar85;
          auVar184._0_4_ = fVar85;
          auVar184._8_4_ = fVar85;
          auVar184._12_4_ = fVar85;
          auVar87 = vfmadd231ps_fma(auVar247,auVar184,auVar121);
          auVar199._0_4_ = local_120 * auVar106._0_4_;
          auVar199._4_4_ = local_120 * auVar106._4_4_;
          auVar199._8_4_ = local_120 * auVar106._8_4_;
          auVar199._12_4_ = local_120 * auVar106._12_4_;
          auVar9 = vfmadd231ps_fma(auVar199,auVar184,auVar9);
          auVar200._0_4_ = local_120 * auVar9._0_4_;
          auVar200._4_4_ = local_120 * auVar9._4_4_;
          auVar200._8_4_ = local_120 * auVar9._8_4_;
          auVar200._12_4_ = local_120 * auVar9._12_4_;
          auVar106 = vfmadd231ps_fma(auVar200,auVar184,auVar87);
          auVar171._0_4_ = fVar155 * (float)local_480._0_4_;
          auVar171._4_4_ = fVar155 * (float)local_480._4_4_;
          auVar171._8_4_ = fVar155 * fStack_478;
          auVar171._12_4_ = fVar155 * fStack_474;
          auVar124._4_4_ = fVar84;
          auVar124._0_4_ = fVar84;
          auVar124._8_4_ = fVar84;
          auVar124._12_4_ = fVar84;
          auVar9 = vfmadd132ps_fma(auVar124,auVar171,local_470);
          auVar152._4_4_ = fVar115;
          auVar152._0_4_ = fVar115;
          auVar152._8_4_ = fVar115;
          auVar152._12_4_ = fVar115;
          auVar9 = vfmadd132ps_fma(auVar152,auVar9,local_460);
          auVar172._0_4_ = auVar106._0_4_ * 3.0;
          auVar172._4_4_ = auVar106._4_4_ * 3.0;
          auVar172._8_4_ = auVar106._8_4_ * 3.0;
          auVar172._12_4_ = auVar106._12_4_ * 3.0;
          auVar137._4_4_ = fVar83;
          auVar137._0_4_ = fVar83;
          auVar137._8_4_ = fVar83;
          auVar137._12_4_ = fVar83;
          auVar106 = vfmadd132ps_fma(auVar137,auVar9,local_450);
          auVar9 = vshufps_avx(auVar172,auVar172,0xc9);
          auVar125._0_4_ = auVar106._0_4_ * auVar9._0_4_;
          auVar125._4_4_ = auVar106._4_4_ * auVar9._4_4_;
          auVar125._8_4_ = auVar106._8_4_ * auVar9._8_4_;
          auVar125._12_4_ = auVar106._12_4_ * auVar9._12_4_;
          auVar9 = vshufps_avx(auVar106,auVar106,0xc9);
          auVar9 = vfmsub231ps_fma(auVar125,auVar172,auVar9);
          local_140 = auVar9._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x100) = fVar59;
            uVar57 = vextractps_avx(auVar9,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar57;
            uVar57 = vextractps_avx(auVar9,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar57;
            *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
            *(float *)(ray + k * 4 + 0x1e0) = local_120;
            *(float *)(ray + k * 4 + 0x200) = fVar82;
            *(uint *)(ray + k * 4 + 0x220) = uVar3;
            *(uint *)(ray + k * 4 + 0x240) = uVar48;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            goto LAB_0110cc50;
          }
          local_100 = auVar8._0_8_;
          auVar8 = vmovshdup_avx(auVar9);
          local_180 = auVar8._0_8_;
          auVar8 = vshufps_avx(auVar9,auVar9,0xaa);
          local_160 = auVar8._0_8_;
          uStack_178 = local_180;
          uStack_170 = local_180;
          uStack_168 = local_180;
          uStack_158 = local_160;
          uStack_150 = local_160;
          uStack_148 = local_160;
          uStack_13c = local_140;
          uStack_138 = local_140;
          uStack_134 = local_140;
          uStack_130 = local_140;
          uStack_12c = local_140;
          uStack_128 = local_140;
          uStack_124 = local_140;
          fStack_11c = local_120;
          fStack_118 = local_120;
          fStack_114 = local_120;
          fStack_110 = local_120;
          fStack_10c = local_120;
          fStack_108 = local_120;
          fStack_104 = local_120;
          uStack_f8 = local_100;
          uStack_f0 = local_100;
          uStack_e8 = local_100;
          local_e0 = CONCAT44(uStack_33c,local_340);
          uStack_d8 = CONCAT44(uStack_334,uStack_338);
          uStack_d0 = CONCAT44(uStack_32c,uStack_330);
          uStack_c8 = CONCAT44(uStack_324,uStack_328);
          local_c0._4_4_ = uStack_31c;
          local_c0._0_4_ = local_320;
          local_c0._8_4_ = uStack_318;
          local_c0._12_4_ = uStack_314;
          local_c0._16_4_ = uStack_310;
          local_c0._20_4_ = uStack_30c;
          local_c0._24_4_ = uStack_308;
          local_c0._28_4_ = uStack_304;
          vpcmpeqd_avx2(local_c0,local_c0);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(float *)(ray + k * 4 + 0x100) = fVar59;
          local_4c0 = local_360;
          local_5f0.valid = (int *)local_4c0;
          local_5f0.geometryUserPtr = pGVar4->userPtr;
          local_5f0.context = context->user;
          local_5f0.hit = (RTCHitN *)&local_180;
          local_5f0.N = 8;
          local_5f0.ray = (RTCRayN *)ray;
          if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            auVar218 = ZEXT1664(auVar121);
            (*pGVar4->intersectionFilterN)(&local_5f0);
          }
          auVar77 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
          auVar77 = _DAT_01f7b020 & ~auVar77;
          if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar77 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar77 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar77 >> 0x7f,0) != '\0') ||
                (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar77 >> 0xbf,0) != '\0') ||
              (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar77[0x1f] < '\0') {
            p_Var5 = context->args->filter;
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              auVar218 = ZEXT1664(auVar218._0_16_);
              (*p_Var5)(&local_5f0);
            }
            auVar15 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
            auVar77 = _DAT_01f7b020 & ~auVar15;
            if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar77 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar77 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar77 >> 0x7f,0) != '\0') ||
                  (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar77 >> 0xbf,0) != '\0') ||
                (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar77[0x1f] < '\0') {
              auVar81._0_8_ = auVar15._0_8_ ^ 0xffffffffffffffff;
              auVar81._8_4_ = auVar15._8_4_ ^ 0xffffffff;
              auVar81._12_4_ = auVar15._12_4_ ^ 0xffffffff;
              auVar81._16_4_ = auVar15._16_4_ ^ 0xffffffff;
              auVar81._20_4_ = auVar15._20_4_ ^ 0xffffffff;
              auVar81._24_4_ = auVar15._24_4_ ^ 0xffffffff;
              auVar81._28_4_ = auVar15._28_4_ ^ 0xffffffff;
              auVar77 = vmaskmovps_avx(auVar81,*(undefined1 (*) [32])local_5f0.hit);
              *(undefined1 (*) [32])(local_5f0.ray + 0x180) = auVar77;
              auVar77 = vmaskmovps_avx(auVar81,*(undefined1 (*) [32])(local_5f0.hit + 0x20));
              *(undefined1 (*) [32])(local_5f0.ray + 0x1a0) = auVar77;
              auVar77 = vmaskmovps_avx(auVar81,*(undefined1 (*) [32])(local_5f0.hit + 0x40));
              *(undefined1 (*) [32])(local_5f0.ray + 0x1c0) = auVar77;
              auVar77 = vmaskmovps_avx(auVar81,*(undefined1 (*) [32])(local_5f0.hit + 0x60));
              *(undefined1 (*) [32])(local_5f0.ray + 0x1e0) = auVar77;
              auVar77 = vmaskmovps_avx(auVar81,*(undefined1 (*) [32])(local_5f0.hit + 0x80));
              *(undefined1 (*) [32])(local_5f0.ray + 0x200) = auVar77;
              auVar77 = vpmaskmovd_avx2(auVar81,*(undefined1 (*) [32])(local_5f0.hit + 0xa0));
              *(undefined1 (*) [32])(local_5f0.ray + 0x220) = auVar77;
              auVar77 = vpmaskmovd_avx2(auVar81,*(undefined1 (*) [32])(local_5f0.hit + 0xc0));
              *(undefined1 (*) [32])(local_5f0.ray + 0x240) = auVar77;
              auVar77 = vpmaskmovd_avx2(auVar81,*(undefined1 (*) [32])(local_5f0.hit + 0xe0));
              *(undefined1 (*) [32])(local_5f0.ray + 0x260) = auVar77;
              auVar77 = vpmaskmovd_avx2(auVar81,*(undefined1 (*) [32])(local_5f0.hit + 0x100));
              *(undefined1 (*) [32])(local_5f0.ray + 0x280) = auVar77;
              goto LAB_0110cc50;
            }
          }
          *(float *)(ray + k * 4 + 0x100) = fVar220;
        }
      }
    }
    goto LAB_0110cc50;
  }
  local_440 = vinsertps_avx(auVar8,ZEXT416((uint)fVar84),0x10);
  auVar64 = vinsertps_avx(auVar177,ZEXT416((uint)auVar178._0_4_),0x10);
  goto LAB_0110c69e;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }